

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cc
# Opt level: O2

int trieste::yaml::reader(UI *ui,UI_STRING *uis)

{
  Reader *this;
  undefined8 *puVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  long lVar3;
  TokenDef *pTVar4;
  TokenDef *in_R9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp_4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp_1;
  initializer_list<std::shared_ptr<trieste::PassDef>_> __l;
  allocator<char> local_b719;
  Reader *local_b718;
  allocator<char> local_b709;
  Token local_b708;
  Token local_b700;
  Token local_b6f8;
  Token local_b6f0;
  Token local_b6e8;
  Token local_b6e0;
  Token local_b6d8;
  Token local_b6d0;
  Token local_b6c8;
  Token local_b6c0;
  Token local_b6b8;
  Token local_b6b0;
  Token local_b6a8;
  Token local_b6a0;
  Token local_b698;
  Token local_b690;
  Located<trieste::detail::Pattern> local_b688;
  Token local_b608;
  Token local_b600;
  Token local_b5f8;
  Token local_b5f0;
  Token local_b5e8;
  Token local_b5e0;
  Token local_b5d8;
  Token local_b5d0;
  Token local_b5c8;
  Token local_b5c0;
  Token local_b5b8;
  Token local_b5b0;
  Token local_b5a8;
  Token local_b5a0;
  Token local_b598;
  Token local_b590;
  Token local_b588;
  Token local_b580;
  Token local_b578;
  Token local_b570;
  Located<trieste::detail::Pattern> local_b568;
  TokenDef local_b4e8;
  Located<trieste::detail::Pattern> local_b4d8;
  __allocator_type __a2_2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b450 [14];
  undefined **local_b3e0;
  __allocator_type __a2_4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_b3d0 [14];
  undefined **local_b360;
  Located<trieste::detail::Pattern> local_b358;
  Located<trieste::detail::Pattern> local_b2d8;
  string local_b258;
  Token local_b238;
  Token local_b230;
  Token local_b228;
  Token local_b220;
  Token local_b218;
  Located<trieste::detail::Pattern> local_b210;
  Pattern local_b190;
  Pattern local_b118;
  __allocator_type __a2_6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_b098 [14];
  undefined **local_b028;
  Pattern local_b020;
  __allocator_type __a2_3;
  Located<trieste::detail::Pattern> local_af30;
  __allocator_type __a2_7;
  Pattern local_ae30;
  Pattern local_adb8;
  Pattern local_ad40;
  Pattern local_acc8;
  Pattern local_ac50;
  Pattern local_abd8;
  Pattern local_ab60;
  Pattern local_aae8;
  Pattern local_aa70;
  Pattern local_a9f8;
  Pattern local_a980;
  Pattern local_a908;
  Pattern local_a890;
  Pattern local_a818;
  Pattern local_a7a0;
  Pattern local_a728;
  Pattern local_a6b0;
  Pattern local_a638;
  Pattern local_a5c0;
  Pattern local_a548;
  Pattern local_a4d0;
  Pattern local_a458;
  Pattern local_a3e0;
  Pattern local_a368;
  Pattern local_a2f0;
  undefined1 local_a278 [32];
  undefined1 local_a258 [32];
  undefined1 local_a238 [32];
  undefined1 local_a218 [32];
  undefined1 local_a1f8 [32];
  undefined1 local_a1d8 [32];
  undefined1 local_a1b8 [32];
  undefined1 local_a198 [16];
  Pattern local_a188;
  Pattern local_a110;
  Pattern local_a098;
  Pattern local_a020;
  Pattern local_9fa8;
  Pattern local_9f30;
  Pattern local_9eb8;
  Pattern local_9e40;
  Pattern local_9dc8;
  Pattern local_9d50;
  Pattern local_9cd8;
  Pattern local_9c60;
  Pattern local_9be8;
  Pattern local_9b70;
  Pattern local_9af8;
  Pattern local_9a80;
  Pattern local_9a08;
  Pattern local_9990;
  _Any_data local_9918 [7];
  vector<std::shared_ptr<trieste::PassDef>,_std::allocator<std::shared_ptr<trieste::PassDef>_>_>
  local_98a0;
  Pattern local_9888;
  Pattern local_9810;
  Pattern local_9798;
  Pattern local_9720;
  __allocator_type __a2_8;
  string local_9630;
  Pattern local_9610;
  Pattern local_9598;
  Pattern local_9520;
  Pattern local_94a8;
  Pattern local_9430;
  Pattern local_93b8;
  Pattern local_9340;
  Pattern local_92c8;
  Pattern local_9250;
  __allocator_type __a2_1;
  Pattern local_9160;
  Pattern local_90e8;
  Pattern local_9070;
  Pattern local_8ff8;
  Pattern local_8f80;
  undefined1 local_8f08 [136];
  _Manager_type p_Stack_8e80;
  code *local_8e78;
  code *local_8e70;
  Located<trieste::detail::Pattern> local_8e68;
  size_t local_8de8;
  undefined1 auStack_8de0 [16];
  code *local_8dd0;
  Located<trieste::detail::Pattern> local_8dc8;
  undefined8 local_8d48;
  undefined8 uStack_8d40;
  code *local_8d38;
  code *local_8d30;
  Located<trieste::detail::Pattern> local_8d28;
  undefined8 local_8ca8;
  undefined8 uStack_8ca0;
  code *local_8c98;
  code *local_8c90;
  Located<trieste::detail::Pattern> local_8c88;
  undefined8 local_8c08;
  undefined8 uStack_8c00;
  code *local_8bf8;
  code *local_8bf0;
  Located<trieste::detail::Pattern> local_8be8;
  undefined8 local_8b68;
  undefined8 uStack_8b60;
  code *local_8b58;
  code *local_8b50;
  Located<trieste::detail::Pattern> local_8b48;
  undefined8 local_8ac8;
  undefined8 uStack_8ac0;
  code *local_8ab8;
  code *local_8ab0;
  Located<trieste::detail::Pattern> local_8aa8;
  undefined8 local_8a28;
  undefined8 uStack_8a20;
  code *local_8a18;
  code *local_8a10;
  Located<trieste::detail::Pattern> local_8a08;
  undefined8 local_8988;
  undefined8 uStack_8980;
  code *local_8978;
  code *local_8970;
  Located<trieste::detail::Pattern> local_8968;
  undefined8 local_88e8;
  undefined8 uStack_88e0;
  code *local_88d8;
  code *local_88d0;
  Located<trieste::detail::Pattern> local_88c8;
  undefined8 local_8848;
  undefined8 uStack_8840;
  code *local_8838;
  code *local_8830;
  undefined1 local_8828 [16];
  code *local_8818;
  code *local_8810;
  undefined **local_87b0;
  vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
  *local_87a8;
  vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
  *pvStack_87a0;
  code *local_8798;
  code *local_8790;
  Located<trieste::detail::Pattern> local_8788;
  vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
  *local_8708;
  vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
  *pvStack_8700;
  code *local_86f8;
  code *local_86f0;
  Located<trieste::detail::Pattern> local_86e8;
  vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
  *local_8668;
  vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
  *pvStack_8660;
  code *local_8658;
  code *local_8650;
  Located<trieste::detail::Pattern> local_8648;
  vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
  *local_85c8;
  vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
  *pvStack_85c0;
  code *local_85b8;
  code *local_85b0;
  Located<trieste::detail::Pattern> local_85a8;
  vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
  *local_8528;
  vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
  *pvStack_8520;
  code *local_8518;
  code *local_8510;
  Located<trieste::detail::Pattern> local_8508;
  vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
  *local_8488;
  vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
  *pvStack_8480;
  code *local_8478;
  code *local_8470;
  Located<trieste::detail::Pattern> local_8468;
  vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
  *local_83e8;
  vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
  *pvStack_83e0;
  code *local_83d8;
  code *local_83d0;
  Located<trieste::detail::Pattern> local_83c8;
  DefaultMap<std::vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>_>
  *local_8348;
  DefaultMap<std::vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>_>
  *pDStack_8340;
  code *local_8338;
  code *local_8330;
  Located<trieste::detail::Pattern> local_8328;
  DefaultMap<std::vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>_>
  *local_82a8;
  DefaultMap<std::vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>_>
  *pDStack_82a0;
  code *local_8298;
  code *local_8290;
  Located<trieste::detail::Pattern> local_8288;
  DefaultMap<std::vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>_>
  *local_8208;
  DefaultMap<std::vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>_>
  *pDStack_8200;
  code *local_81f8;
  code *local_81f0;
  _Any_data local_7f18;
  code *local_7f08;
  code *local_7f00;
  undefined **local_7ea0;
  undefined8 local_7e98;
  undefined8 uStack_7e90;
  code *local_7e88;
  code *local_7e80;
  Located<trieste::detail::Pattern> local_7e78;
  undefined8 local_7df8;
  undefined8 uStack_7df0;
  code *local_7de8;
  code *local_7de0;
  Located<trieste::detail::Pattern> local_7dd8;
  undefined8 local_7d58;
  undefined8 uStack_7d50;
  code *local_7d48;
  code *local_7d40;
  Located<trieste::detail::Pattern> local_7d38;
  undefined8 local_7cb8;
  undefined8 uStack_7cb0;
  code *local_7ca8;
  code *local_7ca0;
  Located<trieste::detail::Pattern> local_7c98;
  undefined8 local_7c18;
  undefined8 uStack_7c10;
  code *local_7c08;
  code *local_7c00;
  Located<trieste::detail::Pattern> local_7bf8;
  undefined8 local_7b78;
  undefined8 uStack_7b70;
  code *local_7b68;
  code *local_7b60;
  Located<trieste::detail::Pattern> local_7b58;
  undefined8 local_7ad8;
  undefined8 uStack_7ad0;
  code *local_7ac8;
  code *local_7ac0;
  Located<trieste::detail::Pattern> local_7ab8;
  undefined8 local_7a38;
  undefined8 uStack_7a30;
  code *local_7a28;
  code *local_7a20;
  Located<trieste::detail::Pattern> local_7a18;
  undefined8 local_7998;
  undefined8 uStack_7990;
  code *local_7988;
  code *local_7980;
  Located<trieste::detail::Pattern> local_7978;
  undefined8 local_78f8;
  undefined8 uStack_78f0;
  code *local_78e8;
  code *local_78e0;
  __allocator_type __a2;
  Located<trieste::detail::Pattern> local_7568;
  vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
  *local_74e8;
  vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
  *pvStack_74e0;
  code *local_74d8;
  code *local_74d0;
  Located<trieste::detail::Pattern> local_74c8;
  vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
  *local_7448;
  vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
  *pvStack_7440;
  code *local_7438;
  code *local_7430;
  Located<trieste::detail::Pattern> local_7428;
  vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
  *local_73a8;
  vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
  *pvStack_73a0;
  code *local_7398;
  code *local_7390;
  Located<trieste::detail::Pattern> local_7388;
  vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
  *local_7308;
  vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
  *pvStack_7300;
  code *local_72f8;
  code *local_72f0;
  Located<trieste::detail::Pattern> local_72e8;
  vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
  *local_7268;
  vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
  *pvStack_7260;
  code *local_7258;
  code *local_7250;
  undefined1 local_6cf8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_6cf0;
  code *local_6ce8;
  code *local_6ce0;
  undefined **local_6c80;
  vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
  *local_6c78;
  vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
  *pvStack_6c70;
  code *local_6c68;
  code *local_6c60;
  Located<trieste::detail::Pattern> local_6c58;
  vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
  *local_6bd8;
  vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
  *pvStack_6bd0;
  code *local_6bc8;
  code *local_6bc0;
  Located<trieste::detail::Pattern> local_6bb8;
  vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
  *local_6b38;
  vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
  *pvStack_6b30;
  code *local_6b28;
  code *local_6b20;
  function<unsigned_long_(std::shared_ptr<trieste::NodeDef>)> local_6468 [4];
  undefined1 local_63e0 [288];
  vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
  *local_62c0;
  vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
  *pvStack_62b8;
  code *local_62b0;
  code *local_62a8;
  Located<trieste::detail::Pattern> local_62a0;
  vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
  *local_6220;
  vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
  *pvStack_6218;
  code *local_6210;
  code *local_6208;
  Located<trieste::detail::Pattern> local_6200;
  vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
  *local_6180;
  vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
  *pvStack_6178;
  code *local_6170;
  code *local_6168;
  Located<trieste::detail::Pattern> local_6160;
  vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
  *local_60e0;
  vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
  *pvStack_60d8;
  code *local_60d0;
  code *local_60c8;
  Located<trieste::detail::Pattern> local_60c0;
  vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
  *local_6040;
  vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
  *pvStack_6038;
  code *local_6030;
  code *local_6028;
  Located<trieste::detail::Pattern> local_6020;
  vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
  *local_5fa0;
  vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
  *pvStack_5f98;
  code *local_5f90;
  code *local_5f88;
  Located<trieste::detail::Pattern> local_5f80;
  DefaultMap<std::vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>_>
  *local_5f00;
  DefaultMap<std::vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>_>
  *pDStack_5ef8;
  code *local_5ef0;
  code *local_5ee8;
  Located<trieste::detail::Pattern> local_5ee0;
  DefaultMap<std::vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>_>
  *local_5e60;
  DefaultMap<std::vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>_>
  *pDStack_5e58;
  code *local_5e50;
  code *local_5e48;
  Located<trieste::detail::Pattern> local_5e40;
  DefaultMap<std::vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>_>
  *local_5dc0;
  DefaultMap<std::vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>_>
  *pDStack_5db8;
  code *local_5db0;
  code *local_5da8;
  Located<trieste::detail::Pattern> local_5da0;
  DefaultMap<std::vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>_>
  *local_5d20;
  DefaultMap<std::vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>_>
  *pDStack_5d18;
  code *local_5d10;
  code *local_5d08;
  undefined1 local_5ad0 [24];
  code *local_5ab8;
  vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
  *local_5a50;
  vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
  *pvStack_5a48;
  code *local_5a40;
  code *local_5a38;
  Located<trieste::detail::Pattern> local_5a30;
  vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
  *local_59b0;
  vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
  *pvStack_59a8;
  code *local_59a0;
  code *local_5998;
  Located<trieste::detail::Pattern> local_5990;
  vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
  *local_5910;
  vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
  *pvStack_5908;
  code *local_5900;
  code *local_58f8;
  Located<trieste::detail::Pattern> local_58f0;
  vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
  *local_5870;
  vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
  *pvStack_5868;
  code *local_5860;
  code *local_5858;
  Located<trieste::detail::Pattern> local_5850;
  vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
  *local_57d0;
  vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
  *pvStack_57c8;
  code *local_57c0;
  code *local_57b8;
  Located<trieste::detail::Pattern> local_57b0;
  vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
  *local_5730;
  vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
  *pvStack_5728;
  code *local_5720;
  code *local_5718;
  Located<trieste::detail::Pattern> local_5710;
  vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
  *local_5690;
  vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
  *pvStack_5688;
  code *local_5680;
  code *local_5678;
  Located<trieste::detail::Pattern> local_5670;
  DefaultMap<std::vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>_>
  *local_55f0;
  DefaultMap<std::vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>_>
  *pDStack_55e8;
  code *local_55e0;
  code *local_55d8;
  PassDef local_51c0;
  PassDef local_48b0;
  undefined1 local_3fa0 [288];
  vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
  *local_3e80;
  vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
  *pvStack_3e78;
  code *local_3e70;
  code *local_3e68;
  PassDef local_3690;
  PassDef local_2d80;
  PassDef local_2470;
  PassDef local_1b60;
  PassDef local_1250;
  PassDef local_940;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_9630,"yaml",&local_b709);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_adb8,"groups",(allocator<char> *)&local_9720);
  local_a2f0.pattern.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)Top;
  In<>((Pattern *)local_8828,(Token *)&local_a2f0);
  local_9990.pattern.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)File;
  T((Pattern *)local_6cf8,(Token *)&local_9990);
  local_9a08.pattern.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)Group;
  T((Pattern *)local_8f08,(Token *)&local_9a08);
  local_9a80.pattern.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)Stream;
  T(&local_b4d8.value,(Token *)&local_9a80);
  local_a368.pattern.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)Stream;
  detail::Pattern::operator[](&local_b688.value,&local_b4d8.value,(Token *)&local_a368);
  detail::Pattern::Pattern((Pattern *)&__a2_4,(Pattern *)End);
  detail::Pattern::operator*(&local_b568.value,&local_b688.value,(Pattern *)&__a2_4);
  detail::Pattern::operator<<((Pattern *)&__a2,(Pattern *)local_8f08,&local_b568.value);
  detail::Pattern::operator<<((Pattern *)&local_51c0,(Pattern *)local_6cf8,(Pattern *)&__a2);
  detail::Pattern::operator*((Pattern *)local_63e0,(Pattern *)local_8828,(Pattern *)&local_51c0);
  detail::Pattern::Pattern((Pattern *)&local_1250,(Pattern *)local_63e0);
  local_1250.rule_map.def.map._M_elems[3] =
       (vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
        *)&PTR_s__workspace_llm4binary_github_lic_00251278;
  detail::Located<trieste::detail::Pattern>::Located
            ((Located<trieste::detail::Pattern> *)local_5ad0,
             (Located<trieste::detail::Pattern> *)&local_1250);
  local_5a50 = (vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
                *)0x0;
  pvStack_5a48 = (vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
                  *)0x0;
  local_5a38 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:951:11)>
               ::_M_invoke;
  local_5a40 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:951:11)>
               ::_M_manager;
  local_9af8.pattern.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)Stream;
  In<>(&local_b210.value,(Token *)&local_9af8);
  local_9b70.pattern.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)Group;
  T((Pattern *)&__a2_7,(Token *)&local_9b70);
  local_9be8.pattern.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)Group;
  T(&local_b358.value,(Token *)&local_9be8);
  local_9c60.pattern.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)Group;
  detail::Pattern::operator[](&local_b2d8.value,&local_b358.value,(Token *)&local_9c60);
  detail::Pattern::operator*((Pattern *)&__a2_6,(Pattern *)&__a2_7,&local_b2d8.value);
  detail::Pattern::operator*((Pattern *)&__a2_2,&local_b210.value,(Pattern *)&__a2_6);
  detail::Pattern::Pattern((Pattern *)&local_1b60,(Pattern *)&__a2_2);
  local_1b60.rule_map.def.map._M_elems[3] =
       (vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
        *)&PTR_s__workspace_llm4binary_github_lic_00251290;
  detail::Located<trieste::detail::Pattern>::Located
            (&local_5a30,(Located<trieste::detail::Pattern> *)&local_1b60);
  local_59b0 = (vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
                *)0x0;
  pvStack_59a8 = (vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
                  *)0x0;
  local_5998 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:954:11)>
               ::_M_invoke;
  local_59a0 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:954:11)>
               ::_M_manager;
  local_9cd8.pattern.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)Stream;
  In<>((Pattern *)&__a2_3,(Token *)&local_9cd8);
  local_9d50.pattern.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)Group;
  T(&local_a818,(Token *)&local_9d50);
  local_9dc8.pattern.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)Group;
  detail::Pattern::operator[](&local_b190,&local_a818,(Token *)&local_9dc8);
  detail::Pattern::operator*(&local_b020,(Pattern *)Start,&local_b190);
  detail::Pattern::Pattern(&local_a890,(Pattern *)End);
  detail::Pattern::operator*(&local_b118,&local_b020,&local_a890);
  detail::Pattern::operator*(&local_af30.value,(Pattern *)&__a2_3,&local_b118);
  detail::Pattern::Pattern((Pattern *)&local_2470,&local_af30.value);
  local_2470.rule_map.def.map._M_elems[3] =
       (vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
        *)&PTR_s__workspace_llm4binary_github_lic_002512a8;
  detail::Located<trieste::detail::Pattern>::Located
            (&local_5990,(Located<trieste::detail::Pattern> *)&local_2470);
  local_5910 = (vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
                *)0x0;
  pvStack_5908 = (vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
                  *)0x0;
  local_58f8 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:957:11)>
               ::_M_invoke;
  local_5900 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:957:11)>
               ::_M_manager;
  local_9e40.pattern.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)Document;
  In<>(&local_a980,(Token *)&local_9e40);
  local_9eb8.pattern.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)Group;
  T(&local_aa70,(Token *)&local_9eb8);
  local_9f30.pattern.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)Group;
  detail::Pattern::operator[](&local_a9f8,&local_aa70,(Token *)&local_9f30);
  detail::Pattern::operator*(&local_a908,&local_a980,&local_a9f8);
  detail::Pattern::Pattern((Pattern *)&local_2d80,&local_a908);
  local_2d80.rule_map.def.map._M_elems[3] =
       (vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
        *)&PTR_s__workspace_llm4binary_github_lic_002512c0;
  detail::Located<trieste::detail::Pattern>::Located
            (&local_58f0,(Located<trieste::detail::Pattern> *)&local_2d80);
  local_5870 = (vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
                *)0x0;
  pvStack_5868 = (vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
                  *)0x0;
  local_5858 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:960:11)>
               ::_M_invoke;
  local_5860 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:960:11)>
               ::_M_manager;
  local_9fa8.pattern.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)FlowMapping;
  In<trieste::TokenDef>(&local_ae30,(Token *)&local_9fa8,(TokenDef *)FlowSequence);
  local_a020.pattern.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)Group;
  T(&local_abd8,(Token *)&local_a020);
  local_a098.pattern.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)Group;
  detail::Pattern::operator[](&local_ab60,&local_abd8,(Token *)&local_a098);
  detail::Pattern::operator*(&local_aae8,&local_ae30,&local_ab60);
  detail::Pattern::Pattern((Pattern *)local_3fa0,&local_aae8);
  local_3fa0._120_8_ = &PTR_s__workspace_llm4binary_github_lic_002512d8;
  detail::Located<trieste::detail::Pattern>::Located
            (&local_5850,(Located<trieste::detail::Pattern> *)local_3fa0);
  local_57d0 = (vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
                *)0x0;
  pvStack_57c8 = (vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
                  *)0x0;
  local_57b8 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:963:11)>
               ::_M_invoke;
  local_57c0 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:963:11)>
               ::_M_manager;
  local_a110.pattern.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)TagDirective;
  In<>(&local_acc8,(Token *)&local_a110);
  local_a188.pattern.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)Group;
  T(&local_a458,(Token *)&local_a188);
  local_9798.pattern.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)Group;
  detail::Pattern::operator[](&local_a3e0,&local_a458,(Token *)&local_9798);
  detail::Pattern::operator*(&local_ac50,&local_acc8,&local_a3e0);
  detail::Pattern::Pattern((Pattern *)&local_3690,&local_ac50);
  local_3690.rule_map.def.map._M_elems[3] =
       (vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
        *)&PTR_s__workspace_llm4binary_github_lic_002512f0;
  detail::Located<trieste::detail::Pattern>::Located
            (&local_57b0,(Located<trieste::detail::Pattern> *)&local_3690);
  local_5730 = (vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
                *)0x0;
  pvStack_5728 = (vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
                  *)0x0;
  local_5718 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:966:11)>
               ::_M_invoke;
  local_5720 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:966:11)>
               ::_M_manager;
  local_9810.pattern.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)Tag;
  In<>(&local_a548,(Token *)&local_9810);
  local_9888.pattern.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)Group;
  T(&local_a638,(Token *)&local_9888);
  local_94a8.pattern.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)Group;
  detail::Pattern::operator[](&local_a5c0,&local_a638,(Token *)&local_94a8);
  detail::Pattern::operator*(&local_a4d0,&local_a548,&local_a5c0);
  detail::Pattern::Pattern((Pattern *)&local_7f18,&local_a4d0);
  local_7ea0 = &PTR_s__workspace_llm4binary_github_lic_00251308;
  detail::Located<trieste::detail::Pattern>::Located
            (&local_5710,(Located<trieste::detail::Pattern> *)&local_7f18);
  local_5690 = (vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
                *)0x0;
  pvStack_5688 = (vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
                  *)0x0;
  local_5678 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:969:11)>
               ::_M_invoke;
  local_5680 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:969:11)>
               ::_M_manager;
  ___a2_8 = StreamGroup;
  In<>(&local_ad40,(Token *)&__a2_8);
  local_9520.pattern.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)Stream;
  T(&local_a7a0,(Token *)&local_9520);
  local_9598.pattern.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)Stream;
  detail::Pattern::operator[](&local_a728,&local_a7a0,(Token *)&local_9598);
  detail::Pattern::operator*(&local_a6b0,&local_ad40,&local_a728);
  detail::Pattern::Pattern((Pattern *)&local_48b0,&local_a6b0);
  local_48b0.rule_map.def.map._M_elems[3] =
       (vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
        *)&PTR_s__workspace_llm4binary_github_lic_00251320;
  detail::Located<trieste::detail::Pattern>::Located
            (&local_5670,(Located<trieste::detail::Pattern> *)&local_48b0);
  local_9918[0]._0_8_ = local_5ad0;
  local_55f0 = (DefaultMap<std::vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>_>
                *)0x0;
  pDStack_55e8 = (DefaultMap<std::vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>_>
                  *)0x0;
  local_55d8 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:973:11)>
               ::_M_invoke;
  local_55e0 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:973:11)>
               ::_M_manager;
  local_9918[0]._8_8_ = &DAT_00000008;
  PassDef::PassDef(&local_940,(string *)&local_adb8,(Wellformed *)(anonymous_namespace)::wf_groups,5
                   ,(initializer_list<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>
                     *)local_9918);
  lVar3 = 0x460;
  do {
    std::
    pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>
    ::~pair((pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>
             *)(local_5ad0 + lVar3));
    lVar3 = lVar3 + -0xa0;
  } while (lVar3 != -0xa0);
  detail::Pattern::~Pattern((Pattern *)&local_48b0);
  detail::Pattern::~Pattern(&local_a6b0);
  detail::Pattern::~Pattern(&local_a728);
  detail::Pattern::~Pattern(&local_a7a0);
  detail::Pattern::~Pattern(&local_ad40);
  detail::Pattern::~Pattern((Pattern *)&local_7f18);
  detail::Pattern::~Pattern(&local_a4d0);
  detail::Pattern::~Pattern(&local_a5c0);
  detail::Pattern::~Pattern(&local_a638);
  detail::Pattern::~Pattern(&local_a548);
  detail::Pattern::~Pattern((Pattern *)&local_3690);
  detail::Pattern::~Pattern(&local_ac50);
  detail::Pattern::~Pattern(&local_a3e0);
  detail::Pattern::~Pattern(&local_a458);
  detail::Pattern::~Pattern(&local_acc8);
  detail::Pattern::~Pattern((Pattern *)local_3fa0);
  detail::Pattern::~Pattern(&local_aae8);
  detail::Pattern::~Pattern(&local_ab60);
  detail::Pattern::~Pattern(&local_abd8);
  detail::Pattern::~Pattern(&local_ae30);
  detail::Pattern::~Pattern((Pattern *)&local_2d80);
  detail::Pattern::~Pattern(&local_a908);
  detail::Pattern::~Pattern(&local_a9f8);
  detail::Pattern::~Pattern(&local_aa70);
  detail::Pattern::~Pattern(&local_a980);
  detail::Pattern::~Pattern((Pattern *)&local_2470);
  detail::Pattern::~Pattern(&local_af30.value);
  detail::Pattern::~Pattern(&local_b118);
  detail::Pattern::~Pattern(&local_a890);
  detail::Pattern::~Pattern(&local_b020);
  detail::Pattern::~Pattern(&local_b190);
  detail::Pattern::~Pattern(&local_a818);
  detail::Pattern::~Pattern((Pattern *)&__a2_3);
  detail::Pattern::~Pattern((Pattern *)&local_1b60);
  detail::Pattern::~Pattern((Pattern *)&__a2_2);
  detail::Pattern::~Pattern((Pattern *)&__a2_6);
  detail::Pattern::~Pattern(&local_b2d8.value);
  detail::Pattern::~Pattern(&local_b358.value);
  detail::Pattern::~Pattern((Pattern *)&__a2_7);
  detail::Pattern::~Pattern(&local_b210.value);
  detail::Pattern::~Pattern((Pattern *)&local_1250);
  detail::Pattern::~Pattern((Pattern *)local_63e0);
  detail::Pattern::~Pattern((Pattern *)&local_51c0);
  detail::Pattern::~Pattern((Pattern *)&__a2);
  detail::Pattern::~Pattern(&local_b568.value);
  detail::Pattern::~Pattern((Pattern *)&__a2_4);
  detail::Pattern::~Pattern(&local_b688.value);
  detail::Pattern::~Pattern(&local_b4d8.value);
  detail::Pattern::~Pattern((Pattern *)local_8f08);
  detail::Pattern::~Pattern((Pattern *)local_6cf8);
  detail::Pattern::~Pattern((Pattern *)local_8828);
  std::__cxx11::string::~string((string *)&local_adb8);
  local_6cf8 = (undefined1  [8])FlowMapping;
  _Stack_6cf0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)FlowSequence;
  local_5ad0._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_8828._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x2;
  local_5ad0._0_8_ = anon_unknown.dwarf_2b40e6::flatten_groups;
  local_5ab8 = std::
               _Function_handler<unsigned_long_(std::shared_ptr<trieste::NodeDef>),_unsigned_long_(*)(std::shared_ptr<trieste::NodeDef>)>
               ::_M_invoke;
  local_5ad0._16_8_ =
       std::
       _Function_handler<unsigned_long_(std::shared_ptr<trieste::NodeDef>),_unsigned_long_(*)(std::shared_ptr<trieste::NodeDef>)>
       ::_M_manager;
  local_8828._0_8_ = (Pattern *)local_6cf8;
  PassDef::pre(&local_940,(initializer_list<trieste::Token> *)local_8828,(F *)local_5ad0);
  CLI::std::_Function_base::~_Function_base((_Function_base *)local_5ad0);
  local_6cf8 = (undefined1  [8])Stream;
  local_8828._0_8_ = (element_type *)0x0;
  local_8828._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_8810 = std::
               _Function_handler<unsigned_long_(std::shared_ptr<trieste::NodeDef>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:977:25)>
               ::_M_invoke;
  local_8818 = std::
               _Function_handler<unsigned_long_(std::shared_ptr<trieste::NodeDef>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:977:25)>
               ::_M_manager;
  PassDef::post(&local_940,(Token *)local_6cf8,(F *)local_8828);
  CLI::std::_Function_base::~_Function_base((_Function_base *)local_8828);
  local_6cf8 = (undefined1  [8])0x0;
  _Stack_6cf0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_6ce0 = std::
               _Function_handler<unsigned_long_(std::shared_ptr<trieste::NodeDef>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:984:17)>
               ::_M_invoke;
  local_6ce8 = std::
               _Function_handler<unsigned_long_(std::shared_ptr<trieste::NodeDef>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:984:17)>
               ::_M_manager;
  std::function<unsigned_long_(std::shared_ptr<trieste::NodeDef>)>::operator=
            ((function<unsigned_long_(std::shared_ptr<trieste::NodeDef>)> *)&local_940.post_once,
             (function<unsigned_long_(std::shared_ptr<trieste::NodeDef>)> *)local_6cf8);
  CLI::std::_Function_base::~_Function_base((_Function_base *)local_6cf8);
  std::make_shared<trieste::PassDef,trieste::PassDef_const>((PassDef *)local_a278);
  anon_unknown.dwarf_2b40e6::values();
  std::make_shared<trieste::PassDef,trieste::PassDef_const>((PassDef *)(local_a278 + 0x10));
  anon_unknown.dwarf_2b40e6::flow();
  std::make_shared<trieste::PassDef,trieste::PassDef_const>((PassDef *)local_a258);
  anon_unknown.dwarf_2b40e6::lines();
  std::make_shared<trieste::PassDef,trieste::PassDef_const>((PassDef *)(local_a258 + 0x10));
  anon_unknown.dwarf_2b40e6::indents();
  std::make_shared<trieste::PassDef,trieste::PassDef_const>((PassDef *)local_a238);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_6cf8,"colgroups",(allocator<char> *)&__a2_4);
  local_8f08._0_8_ = SequenceIndent;
  T((Pattern *)local_63e0,(Token *)local_8f08);
  local_b568.value.pattern.
  super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)SequenceIndent;
  detail::Pattern::operator[]((Pattern *)&local_48b0,(Pattern *)local_63e0,(Token *)&local_b568);
  detail::Pattern::Pattern((Pattern *)&local_3690,(Pattern *)&local_48b0);
  local_3690.rule_map.def.map._M_elems[3] =
       (vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
        *)&PTR_s__workspace_llm4binary_github_lic_00252ba8;
  detail::Located<trieste::detail::Pattern>::Located
            ((Located<trieste::detail::Pattern> *)local_3fa0,
             (Located<trieste::detail::Pattern> *)&local_3690);
  local_3fa0._128_8_ =
       (vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
        *)0x0;
  local_3fa0._136_8_ =
       (vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
        *)0x0;
  local_3fa0._152_8_ =
       std::
       _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:1856:11)>
       ::_M_invoke;
  local_3fa0._144_8_ =
       std::
       _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:1856:11)>
       ::_M_manager;
  local_b688.value.pattern.
  super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)MappingIndent;
  T((Pattern *)&local_51c0,(Token *)&local_b688);
  local_b4d8.value.pattern.
  super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)MappingIndent;
  detail::Pattern::operator[]((Pattern *)local_8828,(Pattern *)&local_51c0,(Token *)&local_b4d8);
  detail::Pattern::Pattern((Pattern *)&local_7f18,(Pattern *)local_8828);
  local_7ea0 = &PTR_s__workspace_llm4binary_github_lic_00252bc0;
  detail::Located<trieste::detail::Pattern>::Located
            ((Located<trieste::detail::Pattern> *)(local_3fa0 + 0xa0),
             (Located<trieste::detail::Pattern> *)&local_7f18);
  ___a2 = local_3fa0;
  local_3e80 = (vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
                *)0x0;
  pvStack_3e78 = (vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
                  *)0x0;
  local_3e68 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:1861:11)>
               ::_M_invoke;
  local_3e70 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:1861:11)>
               ::_M_manager;
  pTVar4 = (TokenDef *)&__a2;
  PassDef::PassDef(&local_2d80,(string *)local_6cf8,
                   (Wellformed *)(anonymous_namespace)::wf_colgroups,5,
                   (initializer_list<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>
                    *)&__a2);
  lVar3 = 0xa0;
  do {
    std::
    pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>
    ::~pair((pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>
             *)(local_3fa0 + lVar3));
    lVar3 = lVar3 + -0xa0;
  } while (lVar3 != -0xa0);
  detail::Pattern::~Pattern((Pattern *)&local_7f18);
  detail::Pattern::~Pattern((Pattern *)local_8828);
  detail::Pattern::~Pattern((Pattern *)&local_51c0);
  detail::Pattern::~Pattern((Pattern *)&local_3690);
  detail::Pattern::~Pattern((Pattern *)&local_48b0);
  detail::Pattern::~Pattern((Pattern *)local_63e0);
  std::__cxx11::string::~string((string *)local_6cf8);
  std::make_shared<trieste::PassDef,trieste::PassDef_const>((PassDef *)(local_a238 + 0x10));
  anon_unknown.dwarf_2b40e6::items();
  std::make_shared<trieste::PassDef,trieste::PassDef_const>((PassDef *)local_a218);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b258,"complex",&local_b719);
  local_b6b8.def = (TokenDef *)Indent;
  In<>((Pattern *)&__a2_2,&local_b6b8);
  local_b6c0.def = (TokenDef *)Line;
  T((Pattern *)&__a2_6,&local_b6c0);
  local_b6c8.def = (TokenDef *)&Whitespace;
  T((Pattern *)&__a2_3,&local_b6c8);
  detail::Pattern::operator~(&local_af30.value,(Pattern *)&__a2_3);
  local_b6d0.def = (TokenDef *)Anchor;
  detail::Pattern::operator[](&local_b118,(Pattern *)(anonymous_namespace)::AnchorTag,&local_b6d0);
  detail::Pattern::operator*(&local_b358.value,&local_af30.value,&local_b118);
  local_b6d8.def = (TokenDef *)Tag;
  detail::Pattern::operator[](&local_b190,(Pattern *)(anonymous_namespace)::AnchorTag,&local_b6d8);
  detail::Pattern::operator~(&local_b020,&local_b190);
  detail::Pattern::operator*(&local_b2d8.value,&local_b358.value,&local_b020);
  detail::Pattern::Pattern(&local_a818,(Pattern *)End);
  detail::Pattern::operator*((Pattern *)&__a2_7,&local_b2d8.value,&local_a818);
  detail::Pattern::operator<<(&local_b210.value,(Pattern *)&__a2_6,(Pattern *)&__a2_7);
  detail::Pattern::operator*((Pattern *)&__a2_4,(Pattern *)&__a2_2,&local_b210.value);
  local_b718 = (Reader *)ui;
  detail::Pattern::Pattern((Pattern *)&local_48b0,(Pattern *)&__a2_4);
  local_48b0.rule_map.def.map._M_elems[3] =
       (vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
        *)&PTR_s__workspace_llm4binary_github_lic_00253630;
  detail::Located<trieste::detail::Pattern>::Located
            ((Located<trieste::detail::Pattern> *)&local_7f18,
             (Located<trieste::detail::Pattern> *)&local_48b0);
  local_7e98 = 0;
  uStack_7e90 = 0;
  local_7e80 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2233:11)>
               ::_M_invoke;
  local_7e88 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2233:11)>
               ::_M_manager;
  local_b6e0.def = (TokenDef *)MappingIndent;
  In<>(&local_a908,&local_b6e0);
  local_b6e8.def = (TokenDef *)Line;
  T(&local_aa70,&local_b6e8);
  local_b6f0.def = (TokenDef *)&Whitespace;
  T(&local_acc8,&local_b6f0);
  detail::Pattern::operator~(&local_ac50,&local_acc8);
  detail::Pattern::operator++(&local_a458,(Pattern *)(anonymous_namespace)::AnchorTag,0);
  local_b6f8.def = (TokenDef *)Lhs;
  detail::Pattern::operator[](&local_a3e0,&local_a458,&local_b6f8);
  detail::Pattern::operator*(&local_abd8,&local_ac50,&local_a3e0);
  local_b700.def = (TokenDef *)Key;
  detail::Pattern::operator[](&local_a4d0,(Pattern *)(anonymous_namespace)::ValueToken,&local_b700);
  detail::Pattern::operator*(&local_ab60,&local_abd8,&local_a4d0);
  local_b708.def = (TokenDef *)&Colon;
  T(&local_a548,&local_b708);
  detail::Pattern::operator*(&local_ae30,&local_ab60,&local_a548);
  detail::Pattern::operator++(&local_a638,(Pattern *)(anonymous_namespace)::AnchorTag,0);
  local_b690.def = (TokenDef *)Rhs;
  detail::Pattern::operator[](&local_a5c0,&local_a638,&local_b690);
  detail::Pattern::operator*(&local_aae8,&local_ae30,&local_a5c0);
  detail::Pattern::operator<<(&local_a9f8,&local_aa70,&local_aae8);
  local_b698.def = (TokenDef *)SequenceItem;
  T(&local_a728,&local_b698);
  detail::Pattern::operator++(&local_ad40,&local_a728,0);
  local_b6a0.def = (TokenDef *)&Value;
  detail::Pattern::operator[](&local_a6b0,&local_ad40,&local_b6a0);
  detail::Pattern::operator*(&local_a980,&local_a9f8,&local_a6b0);
  detail::Pattern::operator*(&local_a890,&local_a908,&local_a980);
  detail::Pattern::Pattern((Pattern *)local_63e0,&local_a890);
  local_63e0._120_8_ = &PTR_s__workspace_llm4binary_github_lic_00253648;
  detail::Located<trieste::detail::Pattern>::Located
            (&local_7e78,(Located<trieste::detail::Pattern> *)local_63e0);
  local_7df8 = 0;
  uStack_7df0 = 0;
  local_7de0 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2244:11)>
               ::_M_invoke;
  local_7de8 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2244:11)>
               ::_M_manager;
  local_b6a8.def = (TokenDef *)Document;
  In<>(&local_adb8,&local_b6a8);
  local_b6b0.def = (TokenDef *)DocumentGroup;
  T(&local_9a08,&local_b6b0);
  local_b570.def = (TokenDef *)Group;
  detail::Pattern::operator[](&local_9990,&local_9a08,&local_b570);
  local_b578.def = (TokenDef *)Indent;
  T(&local_9a80,&local_b578);
  detail::Pattern::operator<<(&local_a2f0,&local_9990,&local_9a80);
  puVar1 = (undefined8 *)operator_new(0x40);
  puVar1[1] = 0x100000001;
  *puVar1 = &PTR___Sp_counted_ptr_inplace_00253760;
  local_51c0.name_._M_dataplus._M_p = (pointer)&__a2;
  CLI::std::__shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2> *)local_8828,
             (__shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2> *)&local_a2f0);
  puVar1[3] = 0;
  puVar1[4] = 0;
  puVar1[2] = &PTR__Action_002537b0;
  CLI::std::__shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2> *)(puVar1 + 6),
             (__shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2> *)local_8828);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_8828 + 8));
  local_51c0.name_._M_string_length = 0;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<trieste::detail::Action<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2250:63)>,_std::allocator<trieste::detail::Action<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2250:63)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<trieste::detail::Action<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_microsoft[P]verona_build_O2__deps_trieste_src_parsers_yaml_reader_cc:2250:63)>,_std::allocator<trieste::detail::Action<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_microsoft[P]verona_build_O2__deps_trieste_src_parsers_yaml_reader_cc:2250:63)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                      *)&local_51c0);
  local_6cf8 = (undefined1  [8])0x0;
  _Stack_6cf0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_51c0.name_._M_dataplus._M_p = (pointer)(puVar1 + 2);
  local_51c0.name_._M_string_length = (size_type)puVar1;
  detail::FastPattern::FastPattern((FastPattern *)local_8828,&local_a2f0.fast_pattern);
  detail::Pattern::Pattern
            ((Pattern *)local_9918,(PatternPtr *)&local_51c0,(FastPattern *)local_8828);
  detail::FastPattern::~FastPattern((FastPattern *)local_8828);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_51c0.name_._M_string_length);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_6cf0);
  detail::Pattern::operator*(&local_a7a0,&local_adb8,(Pattern *)local_9918);
  detail::Pattern::Pattern((Pattern *)local_8828,&local_a7a0);
  local_87b0 = &PTR_s__workspace_llm4binary_github_lic_00253660;
  detail::Located<trieste::detail::Pattern>::Located
            (&local_7dd8,(Located<trieste::detail::Pattern> *)local_8828);
  local_7d58 = 0;
  uStack_7d50 = 0;
  local_7d40 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2254:11)>
               ::_M_invoke;
  local_7d48 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2254:11)>
               ::_M_manager;
  local_b580.def = (TokenDef *)DocumentGroup;
  In<trieste::TokenDef,trieste::TokenDef>
            (&local_9af8,(trieste *)&local_b580,(Token *)KeyGroup,(TokenDef *)ValueGroup,pTVar4);
  local_b588.def = (TokenDef *)Line;
  T(&local_9be8,&local_b588);
  local_b590.def = (TokenDef *)Comment;
  T(&local_9c60,&local_b590);
  detail::Pattern::operator<<(&local_9b70,&local_9be8,&local_9c60);
  detail::Pattern::operator*(&local_a368,&local_9af8,&local_9b70);
  detail::Pattern::Pattern((Pattern *)&local_51c0,&local_a368);
  local_51c0.rule_map.def.map._M_elems[3] =
       (vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
        *)&PTR_s__workspace_llm4binary_github_lic_00253678;
  detail::Located<trieste::detail::Pattern>::Located
            (&local_7d38,(Located<trieste::detail::Pattern> *)&local_51c0);
  local_7cb8 = 0;
  uStack_7cb0 = 0;
  local_7ca0 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2261:11)>
               ::_M_invoke;
  local_7ca8 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2261:11)>
               ::_M_manager;
  local_b598.def = (TokenDef *)ComplexKey;
  In<trieste::TokenDef>(&local_9d50,&local_b598,(TokenDef *)ComplexValue);
  local_b5a0.def = (TokenDef *)SequenceItem;
  T(&local_9eb8,&local_b5a0);
  local_b5a8.def = (TokenDef *)Head;
  detail::Pattern::operator[](&local_9e40,&local_9eb8,&local_b5a8);
  local_b5b0.def = (TokenDef *)SequenceItem;
  T(&local_a020,&local_b5b0);
  detail::Pattern::operator++(&local_9fa8,&local_a020,0);
  local_b5b8.def = (TokenDef *)Tail;
  detail::Pattern::operator[](&local_9f30,&local_9fa8,&local_b5b8);
  detail::Pattern::operator*(&local_9dc8,&local_9e40,&local_9f30);
  detail::Pattern::operator*(&local_9cd8,&local_9d50,&local_9dc8);
  detail::Pattern::Pattern((Pattern *)local_6cf8,&local_9cd8);
  local_6c80 = &PTR_s__workspace_llm4binary_github_lic_00253690;
  detail::Located<trieste::detail::Pattern>::Located
            (&local_7c98,(Located<trieste::detail::Pattern> *)local_6cf8);
  local_7c18 = 0;
  uStack_7c10 = 0;
  local_7c00 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2265:11)>
               ::_M_invoke;
  local_7c08 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2265:11)>
               ::_M_manager;
  local_b5c0.def = (TokenDef *)MappingIndent;
  In<>(&local_a110,&local_b5c0);
  local_b5c8.def = (TokenDef *)ComplexKey;
  T(&local_9810,&local_b5c8);
  local_b5d0.def = (TokenDef *)Key;
  detail::Pattern::operator[](&local_9798,&local_9810,&local_b5d0);
  local_b5d8.def = (TokenDef *)ComplexValue;
  T(&local_94a8,&local_b5d8);
  local_b5e0.def = (TokenDef *)&Value;
  detail::Pattern::operator[](&local_9888,&local_94a8,&local_b5e0);
  detail::Pattern::operator*(&local_a188,&local_9798,&local_9888);
  detail::Pattern::operator*(&local_a098,&local_a110,&local_a188);
  detail::Pattern::Pattern((Pattern *)&__a2,&local_a098);
  detail::Located<trieste::detail::Pattern>::Located
            (&local_7bf8,(Located<trieste::detail::Pattern> *)&__a2);
  local_7b78 = 0;
  uStack_7b70 = 0;
  local_7b60 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2268:11)>
               ::_M_invoke;
  local_7b68 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2268:11)>
               ::_M_manager;
  local_b5e8.def = (TokenDef *)MappingIndent;
  In<>(&local_9520,&local_b5e8);
  local_b5f0.def = (TokenDef *)ComplexKey;
  T(&local_9720,&local_b5f0);
  local_b5f8.def = (TokenDef *)Key;
  detail::Pattern::operator[](&local_9598,&local_9720,&local_b5f8);
  detail::Pattern::operator*((Pattern *)&__a2_8,&local_9520,&local_9598);
  detail::Pattern::Pattern((Pattern *)local_8f08,(Pattern *)&__a2_8);
  local_8f08._120_8_ = &PTR_s__workspace_llm4binary_github_lic_002536c0;
  detail::Located<trieste::detail::Pattern>::Located
            (&local_7b58,(Located<trieste::detail::Pattern> *)local_8f08);
  local_7ad8 = 0;
  uStack_7ad0 = 0;
  local_7ac0 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2274:11)>
               ::_M_invoke;
  local_7ac8 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2274:11)>
               ::_M_manager;
  local_b600.def = (TokenDef *)MappingIndent;
  In<>(&local_9340,&local_b600);
  local_b608.def = (TokenDef *)ComplexValue;
  T(&local_9430,&local_b608);
  local_b218.def = (TokenDef *)&Value;
  detail::Pattern::operator[](&local_93b8,&local_9430,&local_b218);
  detail::Pattern::operator*(&local_92c8,&local_9340,&local_93b8);
  detail::Pattern::Pattern(&local_b568.value,&local_92c8);
  local_b568.location.location._M_impl =
       (source_location)&PTR_s__workspace_llm4binary_github_lic_002536d8;
  detail::Located<trieste::detail::Pattern>::Located(&local_7ab8,&local_b568);
  local_7a38 = 0;
  uStack_7a30 = 0;
  local_7a20 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2280:11)>
               ::_M_invoke;
  local_7a28 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2280:11)>
               ::_M_manager;
  local_b220.def = (TokenDef *)MappingIndent;
  In<trieste::TokenDef>(&local_8f80,&local_b220,(TokenDef *)SequenceIndent);
  local_b228.def = (TokenDef *)Indent;
  T(&local_8ff8,&local_b228);
  local_b230.def = (TokenDef *)Indent;
  detail::Pattern::operator[](&local_9250,&local_8ff8,&local_b230);
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x40);
  local_b4d8.value.pattern.
  super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&__a2_1;
  p_Var2->_M_use_count = 1;
  p_Var2->_M_weak_count = 1;
  p_Var2->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00253870;
  CLI::std::__shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2> *)&local_b688,
             (__shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2> *)&local_9250);
  p_Var2[1]._M_use_count = 0;
  p_Var2[1]._M_weak_count = 0;
  p_Var2[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var2[1]._vptr__Sp_counted_base = (_func_int **)&PTR__Action_002538c0;
  CLI::std::__shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2> *)(p_Var2 + 3),
             (__shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2> *)&local_b688);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_b688.value.pattern.
              super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  local_b4d8.value.pattern.
  super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<trieste::detail::Action<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2285:63)>,_std::allocator<trieste::detail::Action<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2285:63)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<trieste::detail::Action<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_microsoft[P]verona_build_O2__deps_trieste_src_parsers_yaml_reader_cc:2285:63)>,_std::allocator<trieste::detail::Action<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_microsoft[P]verona_build_O2__deps_trieste_src_parsers_yaml_reader_cc:2285:63)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                      *)&local_b4d8);
  local_9610.pattern.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  local_9610.pattern.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_b4d8.value.pattern.
  super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var2 + 1);
  local_b4d8.value.pattern.
  super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var2;
  detail::FastPattern::FastPattern((FastPattern *)&local_b688,&local_9250.fast_pattern);
  detail::Pattern::Pattern((Pattern *)&__a2_1,(PatternPtr *)&local_b4d8,(FastPattern *)&local_b688);
  detail::FastPattern::~FastPattern((FastPattern *)&local_b688);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_b4d8.value.pattern.
              super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_9610.pattern.
              super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  detail::Pattern::operator*(&local_9610,&local_8f80,(Pattern *)&__a2_1);
  detail::Pattern::Pattern(&local_b688.value,&local_9610);
  local_b688.location.location._M_impl =
       (source_location)&PTR_s__workspace_llm4binary_github_lic_002536f0;
  detail::Located<trieste::detail::Pattern>::Located(&local_7a18,&local_b688);
  local_7998 = 0;
  uStack_7990 = 0;
  local_7980 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2288:11)>
               ::_M_invoke;
  local_7988 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2288:11)>
               ::_M_manager;
  local_b238.def = (TokenDef *)Indent;
  T(&local_90e8,&local_b238);
  detail::Pattern::Pattern(&local_9160,(Pattern *)End);
  detail::Pattern::operator<<(&local_9070,&local_90e8,&local_9160);
  detail::Pattern::Pattern(&local_b4d8.value,&local_9070);
  local_b4d8.location.location._M_impl =
       (source_location)&PTR_s__workspace_llm4binary_github_lic_00253708;
  detail::Located<trieste::detail::Pattern>::Located(&local_7978,&local_b4d8);
  local_b4e8.name = (char *)&local_7f18;
  local_78f8 = 0;
  uStack_78f0 = 0;
  local_78e0 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2290:29)>
               ::_M_invoke;
  local_78e8 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2290:29)>
               ::_M_manager;
  pTVar4 = &local_b4e8;
  local_b4e8.fl = 10;
  local_b4e8.default_map_id = 0;
  PassDef::PassDef(&local_3690,&local_b258,(Wellformed *)(anonymous_namespace)::wf_complex,1,
                   (initializer_list<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>
                    *)pTVar4);
  lVar3 = 0x5a0;
  do {
    std::
    pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>
    ::~pair((pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>
             *)((long)&local_7f18 + lVar3));
    lVar3 = lVar3 + -0xa0;
  } while (lVar3 != -0xa0);
  detail::Pattern::~Pattern(&local_b4d8.value);
  detail::Pattern::~Pattern(&local_9070);
  detail::Pattern::~Pattern(&local_9160);
  detail::Pattern::~Pattern(&local_90e8);
  detail::Pattern::~Pattern(&local_b688.value);
  detail::Pattern::~Pattern(&local_9610);
  detail::Pattern::~Pattern((Pattern *)&__a2_1);
  detail::Pattern::~Pattern(&local_9250);
  detail::Pattern::~Pattern(&local_8ff8);
  detail::Pattern::~Pattern(&local_8f80);
  detail::Pattern::~Pattern(&local_b568.value);
  detail::Pattern::~Pattern(&local_92c8);
  detail::Pattern::~Pattern(&local_93b8);
  detail::Pattern::~Pattern(&local_9430);
  detail::Pattern::~Pattern(&local_9340);
  detail::Pattern::~Pattern((Pattern *)local_8f08);
  detail::Pattern::~Pattern((Pattern *)&__a2_8);
  detail::Pattern::~Pattern(&local_9598);
  detail::Pattern::~Pattern(&local_9720);
  detail::Pattern::~Pattern(&local_9520);
  detail::Pattern::~Pattern((Pattern *)&__a2);
  detail::Pattern::~Pattern(&local_a098);
  detail::Pattern::~Pattern(&local_a188);
  detail::Pattern::~Pattern(&local_9888);
  detail::Pattern::~Pattern(&local_94a8);
  detail::Pattern::~Pattern(&local_9798);
  detail::Pattern::~Pattern(&local_9810);
  detail::Pattern::~Pattern(&local_a110);
  detail::Pattern::~Pattern((Pattern *)local_6cf8);
  detail::Pattern::~Pattern(&local_9cd8);
  detail::Pattern::~Pattern(&local_9dc8);
  detail::Pattern::~Pattern(&local_9f30);
  detail::Pattern::~Pattern(&local_9fa8);
  detail::Pattern::~Pattern(&local_a020);
  detail::Pattern::~Pattern(&local_9e40);
  detail::Pattern::~Pattern(&local_9eb8);
  detail::Pattern::~Pattern(&local_9d50);
  detail::Pattern::~Pattern((Pattern *)&local_51c0);
  detail::Pattern::~Pattern(&local_a368);
  detail::Pattern::~Pattern(&local_9b70);
  detail::Pattern::~Pattern(&local_9c60);
  detail::Pattern::~Pattern(&local_9be8);
  detail::Pattern::~Pattern(&local_9af8);
  detail::Pattern::~Pattern((Pattern *)local_8828);
  detail::Pattern::~Pattern(&local_a7a0);
  detail::Pattern::~Pattern((Pattern *)local_9918);
  detail::Pattern::~Pattern(&local_a2f0);
  detail::Pattern::~Pattern(&local_9a80);
  detail::Pattern::~Pattern(&local_9990);
  detail::Pattern::~Pattern(&local_9a08);
  detail::Pattern::~Pattern(&local_adb8);
  detail::Pattern::~Pattern((Pattern *)local_63e0);
  detail::Pattern::~Pattern(&local_a890);
  detail::Pattern::~Pattern(&local_a980);
  detail::Pattern::~Pattern(&local_a6b0);
  detail::Pattern::~Pattern(&local_ad40);
  detail::Pattern::~Pattern(&local_a728);
  detail::Pattern::~Pattern(&local_a9f8);
  detail::Pattern::~Pattern(&local_aae8);
  detail::Pattern::~Pattern(&local_a5c0);
  detail::Pattern::~Pattern(&local_a638);
  detail::Pattern::~Pattern(&local_ae30);
  detail::Pattern::~Pattern(&local_a548);
  detail::Pattern::~Pattern(&local_ab60);
  detail::Pattern::~Pattern(&local_a4d0);
  detail::Pattern::~Pattern(&local_abd8);
  detail::Pattern::~Pattern(&local_a3e0);
  detail::Pattern::~Pattern(&local_a458);
  detail::Pattern::~Pattern(&local_ac50);
  detail::Pattern::~Pattern(&local_acc8);
  detail::Pattern::~Pattern(&local_aa70);
  detail::Pattern::~Pattern(&local_a908);
  detail::Pattern::~Pattern((Pattern *)&local_48b0);
  detail::Pattern::~Pattern((Pattern *)&__a2_4);
  detail::Pattern::~Pattern(&local_b210.value);
  detail::Pattern::~Pattern((Pattern *)&__a2_7);
  detail::Pattern::~Pattern(&local_a818);
  detail::Pattern::~Pattern(&local_b2d8.value);
  detail::Pattern::~Pattern(&local_b020);
  detail::Pattern::~Pattern(&local_b190);
  detail::Pattern::~Pattern(&local_b358.value);
  detail::Pattern::~Pattern(&local_b118);
  detail::Pattern::~Pattern(&local_af30.value);
  detail::Pattern::~Pattern((Pattern *)&__a2_3);
  detail::Pattern::~Pattern((Pattern *)&__a2_6);
  detail::Pattern::~Pattern((Pattern *)&__a2_2);
  std::__cxx11::string::~string((string *)&local_b258);
  local_7f18._M_unused._M_object = (void *)0x0;
  local_7f18._8_8_ = 0;
  local_7f00 = std::
               _Function_handler<unsigned_long_(std::shared_ptr<trieste::NodeDef>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2293:18)>
               ::_M_invoke;
  local_7f08 = std::
               _Function_handler<unsigned_long_(std::shared_ptr<trieste::NodeDef>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2293:18)>
               ::_M_manager;
  std::function<unsigned_long_(std::shared_ptr<trieste::NodeDef>)>::operator=
            ((function<unsigned_long_(std::shared_ptr<trieste::NodeDef>)> *)&local_3690.post_once,
             (function<unsigned_long_(std::shared_ptr<trieste::NodeDef>)> *)&local_7f18);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&local_7f18);
  std::make_shared<trieste::PassDef,trieste::PassDef_const>((PassDef *)(local_a218 + 0x10));
  anon_unknown.dwarf_2b40e6::blocks();
  std::make_shared<trieste::PassDef,trieste::PassDef_const>((PassDef *)local_a1f8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a188,"collections",(allocator<char> *)&local_b6b0);
  local_9810.pattern.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)KeyGroup;
  In<trieste::TokenDef,trieste::TokenDef>
            ((Pattern *)&__a2_7,(trieste *)&local_9810,(Token *)ValueGroup,(TokenDef *)DocumentGroup
             ,pTVar4);
  local_9888.pattern.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)MappingIndent;
  T(&local_b358.value,(Token *)&local_9888);
  local_94a8.pattern.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)MappingIndent;
  detail::Pattern::operator[](&local_b2d8.value,&local_b358.value,(Token *)&local_94a8);
  detail::Pattern::operator*((Pattern *)&__a2_6,(Pattern *)&__a2_7,&local_b2d8.value);
  detail::Pattern::Pattern((Pattern *)local_8828,(Pattern *)&__a2_6);
  local_87b0 = &PTR_s__workspace_llm4binary_github_lic_00254000;
  detail::Located<trieste::detail::Pattern>::Located
            ((Located<trieste::detail::Pattern> *)local_63e0,
             (Located<trieste::detail::Pattern> *)local_8828);
  local_63e0._128_8_ =
       (vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
        *)0x0;
  local_63e0._136_8_ =
       (vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
        *)0x0;
  local_63e0._152_8_ =
       std::
       _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2611:11)>
       ::_M_invoke;
  local_63e0._144_8_ =
       std::
       _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2611:11)>
       ::_M_manager;
  ___a2_8 = KeyGroup;
  In<trieste::TokenDef,trieste::TokenDef>
            ((Pattern *)&__a2_3,(trieste *)&__a2_8,(Token *)ValueGroup,(TokenDef *)DocumentGroup,
             pTVar4);
  local_9520.pattern.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)SequenceIndent;
  T(&local_b020,(Token *)&local_9520);
  local_9598.pattern.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)SequenceIndent;
  detail::Pattern::operator[](&local_b118,&local_b020,(Token *)&local_9598);
  detail::Pattern::operator*(&local_af30.value,(Pattern *)&__a2_3,&local_b118);
  detail::Pattern::Pattern((Pattern *)&local_51c0,&local_af30.value);
  local_51c0.rule_map.def.map._M_elems[3] =
       (vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
        *)&PTR_s__workspace_llm4binary_github_lic_00254018;
  detail::Located<trieste::detail::Pattern>::Located
            ((Located<trieste::detail::Pattern> *)(local_63e0 + 0xa0),
             (Located<trieste::detail::Pattern> *)&local_51c0);
  local_62c0 = (vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
                *)0x0;
  pvStack_62b8 = (vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
                  *)0x0;
  local_62a8 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2615:11)>
               ::_M_invoke;
  local_62b0 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2615:11)>
               ::_M_manager;
  local_9720.pattern.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)KeyGroup;
  In<trieste::TokenDef>(&local_a818,(Token *)&local_9720,(TokenDef *)ValueGroup);
  local_92c8.pattern.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)&Whitespace;
  local_9340.pattern.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)Comment;
  T<>(&local_a890,(Token *)&local_92c8,(Token *)&local_9340);
  detail::Pattern::operator*(&local_b190,&local_a818,&local_a890);
  detail::Pattern::Pattern((Pattern *)local_6cf8,&local_b190);
  local_6c80 = &PTR_s__workspace_llm4binary_github_lic_00254030;
  detail::Located<trieste::detail::Pattern>::Located
            (&local_62a0,(Located<trieste::detail::Pattern> *)local_6cf8);
  local_6220 = (vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
                *)0x0;
  pvStack_6218 = (vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
                  *)0x0;
  local_6208 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2618:11)>
               ::_M_invoke;
  local_6210 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2618:11)>
               ::_M_manager;
  local_93b8.pattern.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)KeyGroup;
  In<trieste::TokenDef,trieste::TokenDef>
            (&local_a980,(trieste *)&local_93b8,(Token *)ValueGroup,(TokenDef *)DocumentGroup,pTVar4
            );
  local_9430.pattern.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)WhitespaceLine;
  T(&local_a9f8,(Token *)&local_9430);
  detail::Pattern::operator*(&local_a908,&local_a980,&local_a9f8);
  detail::Pattern::Pattern((Pattern *)&__a2,&local_a908);
  detail::Located<trieste::detail::Pattern>::Located
            (&local_6200,(Located<trieste::detail::Pattern> *)&__a2);
  local_6180 = (vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
                *)0x0;
  pvStack_6178 = (vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
                  *)0x0;
  local_6168 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2621:11)>
               ::_M_invoke;
  local_6170 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2621:11)>
               ::_M_manager;
  local_9610.pattern.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)Mapping;
  In<trieste::TokenDef,trieste::TokenDef>
            (&local_aae8,(trieste *)&local_9610,(Token *)Sequence,(TokenDef *)DocumentGroup,pTVar4);
  local_8f80.pattern.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)EmptyLine;
  ___a2_1 = WhitespaceLine;
  T<trieste::TokenDef,trieste::TokenDef>
            (&local_ae30,(trieste *)&local_8f80,(Token *)&__a2_1,(Token *)&Whitespace,
             (TokenDef *)Comment,in_R9);
  detail::Pattern::operator*(&local_aa70,&local_aae8,&local_ae30);
  detail::Pattern::Pattern((Pattern *)local_8f08,&local_aa70);
  local_8f08._120_8_ = &PTR_s__workspace_llm4binary_github_lic_00254060;
  detail::Located<trieste::detail::Pattern>::Located
            (&local_6160,(Located<trieste::detail::Pattern> *)local_8f08);
  local_60e0 = (vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
                *)0x0;
  pvStack_60d8 = (vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
                  *)0x0;
  local_60c8 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2625:11)>
               ::_M_invoke;
  local_60d0 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2625:11)>
               ::_M_manager;
  local_9250.pattern.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)FlowMapping;
  In<>(&local_abd8,(Token *)&local_9250);
  local_8ff8.pattern.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)FlowMappingStart;
  T(&local_a3e0,(Token *)&local_8ff8);
  local_9070.pattern.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)FlowMappingItems;
  T(&local_a4d0,(Token *)&local_9070);
  local_90e8.pattern.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)FlowMappingItems;
  detail::Pattern::operator[](&local_a458,&local_a4d0,(Token *)&local_90e8);
  detail::Pattern::operator*(&local_acc8,&local_a3e0,&local_a458);
  local_9160.pattern.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)FlowMappingEnd;
  T(&local_a548,(Token *)&local_9160);
  detail::Pattern::operator*(&local_ac50,&local_acc8,&local_a548);
  detail::Pattern::operator*(&local_ab60,&local_abd8,&local_ac50);
  detail::Pattern::Pattern(&local_b568.value,&local_ab60);
  local_b568.location.location._M_impl =
       (source_location)&PTR_s__workspace_llm4binary_github_lic_00254078;
  detail::Located<trieste::detail::Pattern>::Located(&local_60c0,&local_b568);
  local_6040 = (vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
                *)0x0;
  pvStack_6038 = (vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
                  *)0x0;
  local_6028 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2630:11)>
               ::_M_invoke;
  local_6030 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2630:11)>
               ::_M_manager;
  local_b258._M_dataplus._M_p = FlowSequence;
  In<>(&local_a638,(Token *)&local_b258);
  local_b4e8.name = FlowSequenceStart;
  T(&local_a728,(Token *)&local_b4e8);
  local_b6b8.def = (TokenDef *)FlowSequenceItems;
  T((Pattern *)local_9918,&local_b6b8);
  detail::Pattern::operator++(&local_adb8,(Pattern *)local_9918,0);
  local_b6c0.def = (TokenDef *)FlowSequenceItems;
  detail::Pattern::operator[](&local_a7a0,&local_adb8,&local_b6c0);
  detail::Pattern::operator*(&local_ad40,&local_a728,&local_a7a0);
  local_b6c8.def = (TokenDef *)FlowSequenceEnd;
  T(&local_a2f0,&local_b6c8);
  detail::Pattern::operator*(&local_a6b0,&local_ad40,&local_a2f0);
  detail::Pattern::operator*(&local_a5c0,&local_a638,&local_a6b0);
  detail::Pattern::Pattern(&local_b688.value,&local_a5c0);
  local_b688.location.location._M_impl =
       (source_location)&PTR_s__workspace_llm4binary_github_lic_00254090;
  detail::Located<trieste::detail::Pattern>::Located(&local_6020,&local_b688);
  local_5fa0 = (vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
                *)0x0;
  pvStack_5f98 = (vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
                  *)0x0;
  local_5f88 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2635:11)>
               ::_M_invoke;
  local_5f90 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2635:11)>
               ::_M_manager;
  local_b6d0.def = (TokenDef *)&MappingItem;
  In<>(&local_9a08,&local_b6d0);
  local_b6d8.def = (TokenDef *)ValueGroup;
  T(&local_9af8,&local_b6d8);
  local_b6e0.def = (TokenDef *)&Value;
  detail::Pattern::operator[](&local_a368,&local_9af8,&local_b6e0);
  detail::Pattern::Pattern(&local_9b70,(Pattern *)End);
  detail::Pattern::operator<<(&local_9a80,&local_a368,&local_9b70);
  detail::Pattern::operator*(&local_9990,&local_9a08,&local_9a80);
  detail::Pattern::Pattern(&local_b4d8.value,&local_9990);
  local_b4d8.location.location._M_impl =
       (source_location)&PTR_s__workspace_llm4binary_github_lic_002540a8;
  detail::Located<trieste::detail::Pattern>::Located(&local_5f80,&local_b4d8);
  local_5f00 = (DefaultMap<std::vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>_>
                *)0x0;
  pDStack_5ef8 = (DefaultMap<std::vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>_>
                  *)0x0;
  local_5ee8 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2638:11)>
               ::_M_invoke;
  local_5ef0 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2638:11)>
               ::_M_manager;
  local_b6e8.def = (TokenDef *)DocumentGroup;
  In<>(&local_9c60,&local_b6e8);
  local_b6f0.def = (TokenDef *)MaybeDirective;
  T(&local_9d50,&local_b6f0);
  local_b6f8.def = (TokenDef *)MaybeDirective;
  detail::Pattern::operator[](&local_9cd8,&local_9d50,&local_b6f8);
  detail::Pattern::operator*(&local_9be8,&local_9c60,&local_9cd8);
  detail::Pattern::Pattern((Pattern *)&__a2_4,&local_9be8);
  local_b360 = &PTR_s__workspace_llm4binary_github_lic_002540c0;
  detail::Located<trieste::detail::Pattern>::Located
            (&local_5ee0,(Located<trieste::detail::Pattern> *)&__a2_4);
  local_5e60 = (DefaultMap<std::vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>_>
                *)0x0;
  pDStack_5e58 = (DefaultMap<std::vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>_>
                  *)0x0;
  local_5e48 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2643:11)>
               ::_M_invoke;
  local_5e50 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2643:11)>
               ::_M_manager;
  local_b700.def = (TokenDef *)Mapping;
  In<>(&local_9e40,&local_b700);
  local_b708.def = (TokenDef *)Line;
  T(&local_9f30,&local_b708);
  local_b690.def = (TokenDef *)Line;
  detail::Pattern::operator[](&local_9eb8,&local_9f30,&local_b690);
  detail::Pattern::operator*(&local_9dc8,&local_9e40,&local_9eb8);
  detail::Pattern::Pattern((Pattern *)&__a2_2,&local_9dc8);
  local_b3e0 = &PTR_s__workspace_llm4binary_github_lic_002540d8;
  detail::Located<trieste::detail::Pattern>::Located
            (&local_5e40,(Located<trieste::detail::Pattern> *)&__a2_2);
  local_5dc0 = (DefaultMap<std::vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>_>
                *)0x0;
  pDStack_5db8 = (DefaultMap<std::vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>_>
                  *)0x0;
  local_5da8 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2649:11)>
               ::_M_invoke;
  local_5db0 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2649:11)>
               ::_M_manager;
  local_b698.def = (TokenDef *)Sequence;
  In<>(&local_a020,&local_b698);
  local_b6a0.def = (TokenDef *)Line;
  T(&local_a110,&local_b6a0);
  local_b6a8.def = (TokenDef *)Line;
  detail::Pattern::operator[](&local_a098,&local_a110,&local_b6a8);
  detail::Pattern::operator*(&local_9fa8,&local_a020,&local_a098);
  detail::Pattern::Pattern(&local_b210.value,&local_9fa8);
  local_b210.location.location._M_impl =
       (source_location)&PTR_s__workspace_llm4binary_github_lic_002540f0;
  detail::Located<trieste::detail::Pattern>::Located(&local_5da0,&local_b210);
  local_9798.pattern.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)local_63e0;
  local_5d20 = (DefaultMap<std::vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>_>
                *)0x0;
  pDStack_5d18 = (DefaultMap<std::vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>_>
                  *)0x0;
  local_5d08 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2652:11)>
               ::_M_invoke;
  local_5d10 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2652:11)>
               ::_M_manager;
  local_9798.pattern.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xb;
  PassDef::PassDef(&local_48b0,(string *)&local_a188,
                   (Wellformed *)(anonymous_namespace)::wf_collections,1,
                   (initializer_list<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>
                    *)&local_9798);
  lVar3 = 0x640;
  do {
    std::
    pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>
    ::~pair((pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>
             *)(local_63e0 + lVar3));
    lVar3 = lVar3 + -0xa0;
  } while (lVar3 != -0xa0);
  detail::Pattern::~Pattern(&local_b210.value);
  detail::Pattern::~Pattern(&local_9fa8);
  detail::Pattern::~Pattern(&local_a098);
  detail::Pattern::~Pattern(&local_a110);
  detail::Pattern::~Pattern(&local_a020);
  detail::Pattern::~Pattern((Pattern *)&__a2_2);
  detail::Pattern::~Pattern(&local_9dc8);
  detail::Pattern::~Pattern(&local_9eb8);
  detail::Pattern::~Pattern(&local_9f30);
  detail::Pattern::~Pattern(&local_9e40);
  detail::Pattern::~Pattern((Pattern *)&__a2_4);
  detail::Pattern::~Pattern(&local_9be8);
  detail::Pattern::~Pattern(&local_9cd8);
  detail::Pattern::~Pattern(&local_9d50);
  detail::Pattern::~Pattern(&local_9c60);
  detail::Pattern::~Pattern(&local_b4d8.value);
  detail::Pattern::~Pattern(&local_9990);
  detail::Pattern::~Pattern(&local_9a80);
  detail::Pattern::~Pattern(&local_9b70);
  detail::Pattern::~Pattern(&local_a368);
  detail::Pattern::~Pattern(&local_9af8);
  detail::Pattern::~Pattern(&local_9a08);
  detail::Pattern::~Pattern(&local_b688.value);
  detail::Pattern::~Pattern(&local_a5c0);
  detail::Pattern::~Pattern(&local_a6b0);
  detail::Pattern::~Pattern(&local_a2f0);
  detail::Pattern::~Pattern(&local_ad40);
  detail::Pattern::~Pattern(&local_a7a0);
  detail::Pattern::~Pattern(&local_adb8);
  detail::Pattern::~Pattern((Pattern *)local_9918);
  detail::Pattern::~Pattern(&local_a728);
  detail::Pattern::~Pattern(&local_a638);
  detail::Pattern::~Pattern(&local_b568.value);
  detail::Pattern::~Pattern(&local_ab60);
  detail::Pattern::~Pattern(&local_ac50);
  detail::Pattern::~Pattern(&local_a548);
  detail::Pattern::~Pattern(&local_acc8);
  detail::Pattern::~Pattern(&local_a458);
  detail::Pattern::~Pattern(&local_a4d0);
  detail::Pattern::~Pattern(&local_a3e0);
  detail::Pattern::~Pattern(&local_abd8);
  detail::Pattern::~Pattern((Pattern *)local_8f08);
  detail::Pattern::~Pattern(&local_aa70);
  detail::Pattern::~Pattern(&local_ae30);
  detail::Pattern::~Pattern(&local_aae8);
  detail::Pattern::~Pattern((Pattern *)&__a2);
  detail::Pattern::~Pattern(&local_a908);
  detail::Pattern::~Pattern(&local_a9f8);
  detail::Pattern::~Pattern(&local_a980);
  detail::Pattern::~Pattern((Pattern *)local_6cf8);
  detail::Pattern::~Pattern(&local_b190);
  detail::Pattern::~Pattern(&local_a890);
  detail::Pattern::~Pattern(&local_a818);
  detail::Pattern::~Pattern((Pattern *)&local_51c0);
  detail::Pattern::~Pattern(&local_af30.value);
  detail::Pattern::~Pattern(&local_b118);
  detail::Pattern::~Pattern(&local_b020);
  detail::Pattern::~Pattern((Pattern *)&__a2_3);
  detail::Pattern::~Pattern((Pattern *)local_8828);
  detail::Pattern::~Pattern((Pattern *)&__a2_6);
  detail::Pattern::~Pattern(&local_b2d8.value);
  detail::Pattern::~Pattern(&local_b358.value);
  detail::Pattern::~Pattern((Pattern *)&__a2_7);
  std::__cxx11::string::~string((string *)&local_a188);
  std::make_shared<trieste::PassDef,trieste::PassDef_const>((PassDef *)(local_a1f8 + 0x10));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9610,"attributes",(allocator<char> *)&local_b608);
  ___a2_1 = KeyGroup;
  In<trieste::TokenDef,trieste::TokenDef,trieste::TokenDef>
            ((Pattern *)&__a2_7,(trieste *)&__a2_1,(Token *)ValueGroup,(TokenDef *)DocumentGroup,
             (TokenDef *)FlowGroup,in_R9);
  local_9250.pattern.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)Anchor;
  T(&local_af30.value,(Token *)&local_9250);
  local_8ff8.pattern.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)Anchor;
  detail::Pattern::operator[](&local_b358.value,&local_af30.value,(Token *)&local_8ff8);
  local_9070.pattern.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)&Value;
  detail::Pattern::operator[]
            ((Pattern *)&__a2_3,(Pattern *)(anonymous_namespace)::ValueToken,(Token *)&local_9070);
  detail::Pattern::operator*(&local_b2d8.value,&local_b358.value,(Pattern *)&__a2_3);
  detail::Pattern::operator*((Pattern *)&__a2_6,(Pattern *)&__a2_7,&local_b2d8.value);
  detail::Pattern::Pattern((Pattern *)&local_51c0,(Pattern *)&__a2_6);
  local_51c0.rule_map.def.map._M_elems[3] =
       (vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
        *)&PTR_s__workspace_llm4binary_github_lic_002541b8;
  detail::Located<trieste::detail::Pattern>::Located
            ((Located<trieste::detail::Pattern> *)local_8828,
             (Located<trieste::detail::Pattern> *)&local_51c0);
  local_87a8 = (vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
                *)0x0;
  pvStack_87a0 = (vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
                  *)0x0;
  local_8790 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2665:11)>
               ::_M_invoke;
  local_8798 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2665:11)>
               ::_M_manager;
  local_90e8.pattern.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)KeyGroup;
  In<trieste::TokenDef,trieste::TokenDef,trieste::TokenDef>
            (&local_b020,(trieste *)&local_90e8,(Token *)ValueGroup,(TokenDef *)DocumentGroup,
             (TokenDef *)FlowGroup,in_R9);
  local_9160.pattern.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)Tag;
  T(&local_a890,(Token *)&local_9160);
  local_b258._M_dataplus._M_p = Tag;
  detail::Pattern::operator[](&local_a818,&local_a890,(Token *)&local_b258);
  local_b4e8.name = &Value;
  detail::Pattern::operator[]
            (&local_a908,(Pattern *)(anonymous_namespace)::ValueToken,(Token *)&local_b4e8);
  detail::Pattern::operator*(&local_b190,&local_a818,&local_a908);
  detail::Pattern::operator*(&local_b118,&local_b020,&local_b190);
  detail::Pattern::Pattern((Pattern *)local_6cf8,&local_b118);
  local_6c80 = &PTR_s__workspace_llm4binary_github_lic_002541d0;
  detail::Located<trieste::detail::Pattern>::Located
            (&local_8788,(Located<trieste::detail::Pattern> *)local_6cf8);
  local_8708 = (vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
                *)0x0;
  pvStack_8700 = (vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
                  *)0x0;
  local_86f0 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2669:11)>
               ::_M_invoke;
  local_86f8 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2669:11)>
               ::_M_manager;
  local_b6b8.def = (TokenDef *)KeyGroup;
  In<trieste::TokenDef,trieste::TokenDef,trieste::TokenDef>
            (&local_a9f8,(trieste *)&local_b6b8,(Token *)ValueGroup,(TokenDef *)DocumentGroup,
             (TokenDef *)FlowGroup,in_R9);
  local_b6c0.def = (TokenDef *)Tag;
  T(&local_ae30,&local_b6c0);
  local_b6c8.def = (TokenDef *)Tag;
  detail::Pattern::operator[](&local_aae8,&local_ae30,&local_b6c8);
  detail::Pattern::Pattern(&local_ab60,(Pattern *)End);
  detail::Pattern::operator*(&local_aa70,&local_aae8,&local_ab60);
  detail::Pattern::operator*(&local_a980,&local_a9f8,&local_aa70);
  detail::Pattern::Pattern((Pattern *)&__a2,&local_a980);
  detail::Located<trieste::detail::Pattern>::Located
            (&local_86e8,(Located<trieste::detail::Pattern> *)&__a2);
  local_8668 = (vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
                *)0x0;
  pvStack_8660 = (vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
                  *)0x0;
  local_8650 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2673:11)>
               ::_M_invoke;
  local_8658 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2673:11)>
               ::_M_manager;
  local_b6d0.def = (TokenDef *)DocumentStart;
  In<>(&local_ac50,&local_b6d0);
  local_b6d8.def = (TokenDef *)Tag;
  T(&local_a458,&local_b6d8);
  local_b6e0.def = (TokenDef *)Tag;
  detail::Pattern::operator[](&local_a3e0,&local_a458,&local_b6e0);
  local_b6e8.def = (TokenDef *)DocumentEnd;
  T(&local_a548,&local_b6e8);
  local_b6f0.def = (TokenDef *)DocumentEnd;
  detail::Pattern::operator[](&local_a4d0,&local_a548,&local_b6f0);
  detail::Pattern::operator*(&local_acc8,&local_a3e0,&local_a4d0);
  detail::Pattern::operator*(&local_abd8,&local_ac50,&local_acc8);
  detail::Pattern::Pattern((Pattern *)local_8f08,&local_abd8);
  local_8f08._120_8_ = &PTR_s__workspace_llm4binary_github_lic_00254200;
  detail::Located<trieste::detail::Pattern>::Located
            (&local_8648,(Located<trieste::detail::Pattern> *)local_8f08);
  local_85c8 = (vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
                *)0x0;
  pvStack_85c0 = (vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
                  *)0x0;
  local_85b0 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2676:11)>
               ::_M_invoke;
  local_85b8 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2676:11)>
               ::_M_manager;
  local_b6f8.def = (TokenDef *)TagValue;
  In<>(&local_a638,&local_b6f8);
  local_b700.def = (TokenDef *)Tag;
  T(&local_ad40,&local_b700);
  local_b708.def = (TokenDef *)TagPrefix;
  T(&local_adb8,&local_b708);
  local_b690.def = (TokenDef *)TagPrefix;
  detail::Pattern::operator[](&local_a7a0,&local_adb8,&local_b690);
  local_b698.def = (TokenDef *)&VerbatimTag;
  local_b6a0.def = (TokenDef *)ShorthandTag;
  T<trieste::TokenDef>(&local_a2f0,&local_b698,&local_b6a0,(TokenDef *)NonSpecificTag);
  local_b6a8.def = (TokenDef *)TagName;
  detail::Pattern::operator[]((Pattern *)local_9918,&local_a2f0,&local_b6a8);
  detail::Pattern::operator*(&local_a728,&local_a7a0,(Pattern *)local_9918);
  detail::Pattern::operator<<(&local_a6b0,&local_ad40,&local_a728);
  detail::Pattern::operator*(&local_a5c0,&local_a638,&local_a6b0);
  detail::Pattern::Pattern(&local_b568.value,&local_a5c0);
  local_b568.location.location._M_impl =
       (source_location)&PTR_s__workspace_llm4binary_github_lic_00254218;
  detail::Located<trieste::detail::Pattern>::Located(&local_85a8,&local_b568);
  local_8528 = (vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
                *)0x0;
  pvStack_8520 = (vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
                  *)0x0;
  local_8510 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2685:11)>
               ::_M_invoke;
  local_8518 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2685:11)>
               ::_M_manager;
  local_b6b0.def = (TokenDef *)TagValue;
  In<>(&local_9a08,&local_b6b0);
  local_b570.def = (TokenDef *)TagPrefix;
  T(&local_9be8,&local_b570);
  local_b578.def = (TokenDef *)TagPrefix;
  detail::Pattern::operator[](&local_9b70,&local_9be8,&local_b578);
  local_b580.def = (TokenDef *)TagName;
  T(&local_9cd8,&local_b580);
  local_b588.def = (TokenDef *)TagName;
  detail::Pattern::operator[](&local_9c60,&local_9cd8,&local_b588);
  detail::Pattern::operator*(&local_9af8,&local_9b70,&local_9c60);
  local_b590.def = (TokenDef *)Null;
  T(&local_9d50,&local_b590);
  detail::Pattern::operator*(&local_a368,&local_9af8,&local_9d50);
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x40);
  p_Var2->_M_use_count = 1;
  p_Var2->_M_weak_count = 1;
  p_Var2->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00254318;
  local_b4d8.value.pattern.
  super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&__a2_2;
  CLI::std::__shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2> *)&local_b688,
             (__shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2> *)&local_a368);
  p_Var2[1]._M_use_count = 0;
  p_Var2[1]._M_weak_count = 0;
  p_Var2[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var2[1]._vptr__Sp_counted_base = (_func_int **)&PTR__Action_00254368;
  CLI::std::__shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2> *)(p_Var2 + 3),
             (__shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2> *)&local_b688);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_b688.value.pattern.
              super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  local_b4d8.value.pattern.
  super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<trieste::detail::Action<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2691:23)>,_std::allocator<trieste::detail::Action<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2691:23)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<trieste::detail::Action<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_microsoft[P]verona_build_O2__deps_trieste_src_parsers_yaml_reader_cc:2691:23)>,_std::allocator<trieste::detail::Action<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_microsoft[P]verona_build_O2__deps_trieste_src_parsers_yaml_reader_cc:2691:23)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                      *)&local_b4d8);
  ___a2_4 = (element_type *)0x0;
  a_Stack_b3d0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_b4d8.value.pattern.
  super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var2 + 1);
  local_b4d8.value.pattern.
  super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var2;
  detail::FastPattern::FastPattern((FastPattern *)&local_b688,&local_a368.fast_pattern);
  detail::Pattern::Pattern(&local_9a80,(PatternPtr *)&local_b4d8,(FastPattern *)&local_b688);
  detail::FastPattern::~FastPattern((FastPattern *)&local_b688);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_b4d8.value.pattern.
              super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_b3d0);
  detail::Pattern::operator*(&local_9990,&local_9a08,&local_9a80);
  detail::Pattern::Pattern(&local_b688.value,&local_9990);
  local_b688.location.location._M_impl =
       (source_location)&PTR_s__workspace_llm4binary_github_lic_00254230;
  detail::Located<trieste::detail::Pattern>::Located(&local_8508,&local_b688);
  local_8488 = (vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
                *)0x0;
  pvStack_8480 = (vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
                  *)0x0;
  local_8470 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2696:11)>
               ::_M_invoke;
  local_8478 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2696:11)>
               ::_M_manager;
  local_b598.def = (TokenDef *)FlowMapping;
  In<>(&local_9e40,&local_b598);
  local_b5a0.def = (TokenDef *)FlowMappingStart;
  T(&local_9f30,&local_b5a0);
  local_b5a8.def = (TokenDef *)FlowMappingStart;
  detail::Pattern::operator[](&local_9eb8,&local_9f30,&local_b5a8);
  detail::Pattern::operator*(&local_9dc8,&local_9e40,&local_9eb8);
  detail::Pattern::Pattern(&local_b4d8.value,&local_9dc8);
  local_b4d8.location.location._M_impl =
       (source_location)&PTR_s__workspace_llm4binary_github_lic_00254248;
  detail::Located<trieste::detail::Pattern>::Located(&local_8468,&local_b4d8);
  local_83e8 = (vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
                *)0x0;
  pvStack_83e0 = (vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
                  *)0x0;
  local_83d0 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2703:11)>
               ::_M_invoke;
  local_83d8 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2703:11)>
               ::_M_manager;
  local_b5b0.def = (TokenDef *)FlowSequence;
  In<>(&local_a020,&local_b5b0);
  local_b5b8.def = (TokenDef *)FlowSequenceStart;
  T(&local_a110,&local_b5b8);
  local_b5c0.def = (TokenDef *)FlowSequenceStart;
  detail::Pattern::operator[](&local_a098,&local_a110,&local_b5c0);
  detail::Pattern::operator*(&local_9fa8,&local_a020,&local_a098);
  detail::Pattern::Pattern((Pattern *)&__a2_4,&local_9fa8);
  local_b360 = &PTR_s__workspace_llm4binary_github_lic_00254260;
  detail::Located<trieste::detail::Pattern>::Located
            (&local_83c8,(Located<trieste::detail::Pattern> *)&__a2_4);
  local_8348 = (DefaultMap<std::vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>_>
                *)0x0;
  pDStack_8340 = (DefaultMap<std::vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>_>
                  *)0x0;
  local_8330 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2709:11)>
               ::_M_invoke;
  local_8338 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2709:11)>
               ::_M_manager;
  local_b5c8.def = (TokenDef *)KeyGroup;
  In<trieste::TokenDef,trieste::TokenDef,trieste::TokenDef>
            (&local_9798,(trieste *)&local_b5c8,(Token *)ValueGroup,(TokenDef *)DocumentGroup,
             (TokenDef *)FlowGroup,in_R9);
  local_b5d0.def = (TokenDef *)Anchor;
  T(&local_94a8,&local_b5d0);
  local_b5d8.def = (TokenDef *)Anchor;
  detail::Pattern::operator[](&local_9888,&local_94a8,&local_b5d8);
  detail::Pattern::Pattern((Pattern *)&__a2_8,(Pattern *)End);
  detail::Pattern::operator*(&local_9810,&local_9888,(Pattern *)&__a2_8);
  detail::Pattern::operator*(&local_a188,&local_9798,&local_9810);
  detail::Pattern::Pattern((Pattern *)&__a2_2,&local_a188);
  local_b3e0 = &PTR_s__workspace_llm4binary_github_lic_00254278;
  detail::Located<trieste::detail::Pattern>::Located
            (&local_8328,(Located<trieste::detail::Pattern> *)&__a2_2);
  local_82a8 = (DefaultMap<std::vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>_>
                *)0x0;
  pDStack_82a0 = (DefaultMap<std::vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>_>
                  *)0x0;
  local_8290 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2716:11)>
               ::_M_invoke;
  local_8298 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2716:11)>
               ::_M_manager;
  local_b5e0.def = (TokenDef *)DocumentGroup;
  In<>(&local_9598,&local_b5e0);
  local_b5e8.def = (TokenDef *)Tag;
  T(&local_9340,&local_b5e8);
  local_b5f0.def = (TokenDef *)Tag;
  detail::Pattern::operator[](&local_92c8,&local_9340,&local_b5f0);
  local_b5f8.def = (TokenDef *)DocumentStart;
  T(&local_9430,&local_b5f8);
  local_b600.def = (TokenDef *)DocumentStart;
  detail::Pattern::operator[](&local_93b8,&local_9430,&local_b600);
  detail::Pattern::operator*(&local_9720,&local_92c8,&local_93b8);
  detail::Pattern::operator*(&local_9520,&local_9598,&local_9720);
  detail::Pattern::Pattern(&local_b210.value,&local_9520);
  local_b210.location.location._M_impl =
       (source_location)&PTR_s__workspace_llm4binary_github_lic_00254290;
  detail::Located<trieste::detail::Pattern>::Located(&local_8288,&local_b210);
  local_8f80.pattern.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)local_8828;
  local_8208 = (DefaultMap<std::vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>_>
                *)0x0;
  pDStack_8200 = (DefaultMap<std::vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>_>
                  *)0x0;
  local_81f0 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2719:11)>
               ::_M_invoke;
  local_81f8 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2719:11)>
               ::_M_manager;
  local_8f80.pattern.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xa;
  PassDef::PassDef((PassDef *)local_63e0,(string *)&local_9610,
                   (Wellformed *)(anonymous_namespace)::wf_attributes,1,
                   (initializer_list<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>
                    *)&local_8f80);
  lVar3 = 0x5a0;
  do {
    std::
    pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>
    ::~pair((pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>
             *)(local_8828 + lVar3));
    lVar3 = lVar3 + -0xa0;
  } while (lVar3 != -0xa0);
  detail::Pattern::~Pattern(&local_b210.value);
  detail::Pattern::~Pattern(&local_9520);
  detail::Pattern::~Pattern(&local_9720);
  detail::Pattern::~Pattern(&local_93b8);
  detail::Pattern::~Pattern(&local_9430);
  detail::Pattern::~Pattern(&local_92c8);
  detail::Pattern::~Pattern(&local_9340);
  detail::Pattern::~Pattern(&local_9598);
  detail::Pattern::~Pattern((Pattern *)&__a2_2);
  detail::Pattern::~Pattern(&local_a188);
  detail::Pattern::~Pattern(&local_9810);
  detail::Pattern::~Pattern((Pattern *)&__a2_8);
  detail::Pattern::~Pattern(&local_9888);
  detail::Pattern::~Pattern(&local_94a8);
  detail::Pattern::~Pattern(&local_9798);
  detail::Pattern::~Pattern((Pattern *)&__a2_4);
  detail::Pattern::~Pattern(&local_9fa8);
  detail::Pattern::~Pattern(&local_a098);
  detail::Pattern::~Pattern(&local_a110);
  detail::Pattern::~Pattern(&local_a020);
  detail::Pattern::~Pattern(&local_b4d8.value);
  detail::Pattern::~Pattern(&local_9dc8);
  detail::Pattern::~Pattern(&local_9eb8);
  detail::Pattern::~Pattern(&local_9f30);
  detail::Pattern::~Pattern(&local_9e40);
  detail::Pattern::~Pattern(&local_b688.value);
  detail::Pattern::~Pattern(&local_9990);
  detail::Pattern::~Pattern(&local_9a80);
  detail::Pattern::~Pattern(&local_a368);
  detail::Pattern::~Pattern(&local_9d50);
  detail::Pattern::~Pattern(&local_9af8);
  detail::Pattern::~Pattern(&local_9c60);
  detail::Pattern::~Pattern(&local_9cd8);
  detail::Pattern::~Pattern(&local_9b70);
  detail::Pattern::~Pattern(&local_9be8);
  detail::Pattern::~Pattern(&local_9a08);
  detail::Pattern::~Pattern(&local_b568.value);
  detail::Pattern::~Pattern(&local_a5c0);
  detail::Pattern::~Pattern(&local_a6b0);
  detail::Pattern::~Pattern(&local_a728);
  detail::Pattern::~Pattern((Pattern *)local_9918);
  detail::Pattern::~Pattern(&local_a2f0);
  detail::Pattern::~Pattern(&local_a7a0);
  detail::Pattern::~Pattern(&local_adb8);
  detail::Pattern::~Pattern(&local_ad40);
  detail::Pattern::~Pattern(&local_a638);
  detail::Pattern::~Pattern((Pattern *)local_8f08);
  detail::Pattern::~Pattern(&local_abd8);
  detail::Pattern::~Pattern(&local_acc8);
  detail::Pattern::~Pattern(&local_a4d0);
  detail::Pattern::~Pattern(&local_a548);
  detail::Pattern::~Pattern(&local_a3e0);
  detail::Pattern::~Pattern(&local_a458);
  detail::Pattern::~Pattern(&local_ac50);
  detail::Pattern::~Pattern((Pattern *)&__a2);
  detail::Pattern::~Pattern(&local_a980);
  detail::Pattern::~Pattern(&local_aa70);
  detail::Pattern::~Pattern(&local_ab60);
  detail::Pattern::~Pattern(&local_aae8);
  detail::Pattern::~Pattern(&local_ae30);
  detail::Pattern::~Pattern(&local_a9f8);
  detail::Pattern::~Pattern((Pattern *)local_6cf8);
  detail::Pattern::~Pattern(&local_b118);
  detail::Pattern::~Pattern(&local_b190);
  detail::Pattern::~Pattern(&local_a908);
  detail::Pattern::~Pattern(&local_a818);
  detail::Pattern::~Pattern(&local_a890);
  detail::Pattern::~Pattern(&local_b020);
  detail::Pattern::~Pattern((Pattern *)&local_51c0);
  detail::Pattern::~Pattern((Pattern *)&__a2_6);
  detail::Pattern::~Pattern(&local_b2d8.value);
  detail::Pattern::~Pattern((Pattern *)&__a2_3);
  detail::Pattern::~Pattern(&local_b358.value);
  detail::Pattern::~Pattern(&local_af30.value);
  detail::Pattern::~Pattern((Pattern *)&__a2_7);
  std::__cxx11::string::~string((string *)&local_9610);
  std::make_shared<trieste::PassDef,trieste::PassDef_const>((PassDef *)local_a1d8);
  anon_unknown.dwarf_2b40e6::structure();
  std::make_shared<trieste::PassDef,trieste::PassDef_const>((PassDef *)(local_a1d8 + 0x10));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b190,"tags",(allocator<char> *)&local_acc8);
  local_a908.pattern.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)Sequence;
  In<>(&local_b4d8.value,(Token *)&local_a908);
  local_a980.pattern.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)SequenceItem;
  T((Pattern *)&__a2_2,(Token *)&local_a980);
  local_a9f8.pattern.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)SequenceItem;
  detail::Pattern::operator[]((Pattern *)&__a2_4,(Pattern *)&__a2_2,(Token *)&local_a9f8);
  detail::Pattern::operator*(&local_b688.value,&local_b4d8.value,(Pattern *)&__a2_4);
  detail::Pattern::Pattern((Pattern *)&__a2,&local_b688.value);
  detail::Located<trieste::detail::Pattern>::Located
            ((Located<trieste::detail::Pattern> *)local_6cf8,
             (Located<trieste::detail::Pattern> *)&__a2);
  local_6c78 = (vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
                *)0x0;
  pvStack_6c70 = (vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
                  *)0x0;
  local_6c60 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2827:11)>
               ::_M_invoke;
  local_6c68 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2827:11)>
               ::_M_manager;
  local_aa70.pattern.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)FlowSequence;
  In<>((Pattern *)&__a2_6,(Token *)&local_aa70);
  local_aae8.pattern.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)FlowSequenceItem;
  T(&local_b2d8.value,(Token *)&local_aae8);
  local_ae30.pattern.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)FlowSequenceItem;
  detail::Pattern::operator[]((Pattern *)&__a2_7,&local_b2d8.value,(Token *)&local_ae30);
  detail::Pattern::operator*(&local_b210.value,(Pattern *)&__a2_6,(Pattern *)&__a2_7);
  detail::Pattern::Pattern((Pattern *)local_8f08,&local_b210.value);
  local_8f08._120_8_ = &PTR_s__workspace_llm4binary_github_lic_002546a0;
  detail::Located<trieste::detail::Pattern>::Located
            (&local_6c58,(Located<trieste::detail::Pattern> *)local_8f08);
  local_6bd8 = (vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
                *)0x0;
  pvStack_6bd0 = (vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
                  *)0x0;
  local_6bc0 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2830:11)>
               ::_M_invoke;
  local_6bc8 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2830:11)>
               ::_M_manager;
  local_ab60.pattern.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)TagValue;
  In<>(&local_af30.value,(Token *)&local_ab60);
  local_abd8.pattern.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)TagPrefix;
  T(&local_b020,(Token *)&local_abd8);
  local_ac50.pattern.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)TagPrefix;
  detail::Pattern::operator[](&local_b118,&local_b020,(Token *)&local_ac50);
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x40);
  p_Var2->_M_use_count = 1;
  p_Var2->_M_weak_count = 1;
  p_Var2->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00254710;
  local_b358.value.pattern.
  super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&__a2_3;
  CLI::std::__shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2> *)&local_b568,
             (__shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2> *)&local_b118);
  p_Var2[1]._M_use_count = 0;
  p_Var2[1]._M_weak_count = 0;
  p_Var2[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var2[1]._vptr__Sp_counted_base = (_func_int **)&PTR__Action_00254760;
  CLI::std::__shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2> *)(p_Var2 + 3),
             (__shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2> *)&local_b568);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_b568.value.pattern.
              super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  local_b358.value.pattern.
  super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<trieste::detail::Action<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2832:48)>,_std::allocator<trieste::detail::Action<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2832:48)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<trieste::detail::Action<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_microsoft[P]verona_build_O2__deps_trieste_src_parsers_yaml_reader_cc:2832:48)>,_std::allocator<trieste::detail::Action<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_microsoft[P]verona_build_O2__deps_trieste_src_parsers_yaml_reader_cc:2832:48)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                      *)&local_b358);
  local_a818.pattern.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  local_a818.pattern.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_b358.value.pattern.
  super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var2 + 1);
  local_b358.value.pattern.
  super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var2;
  detail::FastPattern::FastPattern((FastPattern *)&local_b568,&local_b118.fast_pattern);
  detail::Pattern::Pattern((Pattern *)&__a2_3,(PatternPtr *)&local_b358,(FastPattern *)&local_b568);
  detail::FastPattern::~FastPattern((FastPattern *)&local_b568);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_b358.value.pattern.
              super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_a818.pattern.
              super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  detail::Pattern::operator*(&local_b358.value,&local_af30.value,(Pattern *)&__a2_3);
  detail::Pattern::Pattern(&local_b568.value,&local_b358.value);
  local_b568.location.location._M_impl =
       (source_location)&PTR_s__workspace_llm4binary_github_lic_002546b8;
  detail::Located<trieste::detail::Pattern>::Located(&local_6bb8,&local_b568);
  local_a890.pattern.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)local_6cf8;
  local_6b38 = (vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
                *)0x0;
  pvStack_6b30 = (vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
                  *)0x0;
  local_6b20 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2836:11)>
               ::_M_invoke;
  local_6b28 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2836:11)>
               ::_M_manager;
  local_a890.pattern.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3;
  PassDef::PassDef(&local_51c0,(string *)&local_b190,(Wellformed *)(anonymous_namespace)::wf_tags,1,
                   (initializer_list<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>
                    *)&local_a890);
  lVar3 = 0x140;
  do {
    std::
    pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>
    ::~pair((pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>
             *)(local_6cf8 + lVar3));
    lVar3 = lVar3 + -0xa0;
  } while (lVar3 != -0xa0);
  detail::Pattern::~Pattern(&local_b568.value);
  detail::Pattern::~Pattern(&local_b358.value);
  detail::Pattern::~Pattern((Pattern *)&__a2_3);
  detail::Pattern::~Pattern(&local_b118);
  detail::Pattern::~Pattern(&local_b020);
  detail::Pattern::~Pattern(&local_af30.value);
  detail::Pattern::~Pattern((Pattern *)local_8f08);
  detail::Pattern::~Pattern(&local_b210.value);
  detail::Pattern::~Pattern((Pattern *)&__a2_7);
  detail::Pattern::~Pattern(&local_b2d8.value);
  detail::Pattern::~Pattern((Pattern *)&__a2_6);
  detail::Pattern::~Pattern((Pattern *)&__a2);
  detail::Pattern::~Pattern(&local_b688.value);
  detail::Pattern::~Pattern((Pattern *)&__a2_4);
  detail::Pattern::~Pattern((Pattern *)&__a2_2);
  detail::Pattern::~Pattern(&local_b4d8.value);
  std::__cxx11::string::~string((string *)&local_b190);
  std::make_shared<trieste::PassDef,trieste::PassDef_const>((PassDef *)local_a1b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9888,"quotes",(allocator<char> *)&local_b708);
  ___a2_8 = DoubleQuote;
  T((Pattern *)&__a2_7,(Token *)&__a2_8);
  local_9520.pattern.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)DoubleQuote;
  detail::Pattern::operator[]((Pattern *)&__a2_6,(Pattern *)&__a2_7,(Token *)&local_9520);
  detail::Pattern::Pattern(&local_b2d8.value,(Pattern *)End);
  detail::Pattern::operator<<(&local_b210.value,(Pattern *)&__a2_6,&local_b2d8.value);
  detail::Pattern::Pattern((Pattern *)local_8f08,&local_b210.value);
  local_8f08._120_8_ = &PTR_s__workspace_llm4binary_github_lic_002547b0;
  detail::Located<trieste::detail::Pattern>::Located
            ((Located<trieste::detail::Pattern> *)&__a2,
             (Located<trieste::detail::Pattern> *)local_8f08);
  local_9598.pattern.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)SingleQuote;
  T((Pattern *)&__a2_3,(Token *)&local_9598);
  local_9720.pattern.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)SingleQuote;
  detail::Pattern::operator[](&local_af30.value,(Pattern *)&__a2_3,(Token *)&local_9720);
  detail::Pattern::Pattern(&local_b118,(Pattern *)End);
  detail::Pattern::operator<<(&local_b358.value,&local_af30.value,&local_b118);
  detail::Pattern::Pattern(&local_b568.value,&local_b358.value);
  local_b568.location.location._M_impl =
       (source_location)&PTR_s__workspace_llm4binary_github_lic_002547c8;
  detail::Located<trieste::detail::Pattern>::Located(&local_7568,&local_b568);
  local_74e8 = (vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
                *)0x0;
  pvStack_74e0 = (vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
                  *)0x0;
  local_74d0 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2867:12)>
               ::_M_invoke;
  local_74d8 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2867:12)>
               ::_M_manager;
  local_92c8.pattern.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)Literal;
  In<trieste::TokenDef>(&local_b190,(Token *)&local_92c8,(TokenDef *)Folded);
  local_9340.pattern.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)BlockGroup;
  T(&local_a890,(Token *)&local_9340);
  local_93b8.pattern.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)BlockLine;
  T(&local_aa70,(Token *)&local_93b8);
  detail::Pattern::operator++(&local_a9f8,&local_aa70,0);
  local_9430.pattern.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)BlockLine;
  detail::Pattern::operator[](&local_a980,&local_a9f8,(Token *)&local_9430);
  detail::Pattern::Pattern(&local_aae8,(Pattern *)End);
  detail::Pattern::operator*(&local_a908,&local_a980,&local_aae8);
  detail::Pattern::operator<<(&local_a818,&local_a890,&local_a908);
  detail::Pattern::operator*(&local_b020,&local_b190,&local_a818);
  detail::Pattern::Pattern(&local_b688.value,&local_b020);
  local_b688.location.location._M_impl =
       (source_location)&PTR_s__workspace_llm4binary_github_lic_002547e0;
  detail::Located<trieste::detail::Pattern>::Located(&local_74c8,&local_b688);
  local_7448 = (vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
                *)0x0;
  pvStack_7440 = (vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
                  *)0x0;
  local_7430 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2879:12)>
               ::_M_invoke;
  local_7438 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2879:12)>
               ::_M_manager;
  local_9610.pattern.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)Literal;
  In<trieste::TokenDef>(&local_ab60,(Token *)&local_9610,(TokenDef *)Folded);
  local_8f80.pattern.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)BlockGroup;
  T(&local_ac50,(Token *)&local_8f80);
  ___a2_1 = IndentIndicator;
  T(&local_a548,(Token *)&__a2_1);
  local_9250.pattern.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)IndentIndicator;
  detail::Pattern::operator[](&local_a4d0,&local_a548,(Token *)&local_9250);
  local_8ff8.pattern.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)ChompIndicator;
  T(&local_a638,(Token *)&local_8ff8);
  local_9070.pattern.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)ChompIndicator;
  detail::Pattern::operator[](&local_a5c0,&local_a638,(Token *)&local_9070);
  detail::Pattern::operator*(&local_a458,&local_a4d0,&local_a5c0);
  local_90e8.pattern.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)BlockLine;
  T(&local_a728,(Token *)&local_90e8);
  detail::Pattern::operator++(&local_ad40,&local_a728,0);
  local_9160.pattern.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)BlockLine;
  detail::Pattern::operator[](&local_a6b0,&local_ad40,(Token *)&local_9160);
  detail::Pattern::operator*(&local_a3e0,&local_a458,&local_a6b0);
  detail::Pattern::Pattern(&local_a7a0,(Pattern *)End);
  detail::Pattern::operator*(&local_acc8,&local_a3e0,&local_a7a0);
  detail::Pattern::operator<<(&local_abd8,&local_ac50,&local_acc8);
  detail::Pattern::operator*(&local_ae30,&local_ab60,&local_abd8);
  detail::Pattern::Pattern(&local_b4d8.value,&local_ae30);
  local_b4d8.location.location._M_impl =
       (source_location)&PTR_s__workspace_llm4binary_github_lic_002547f8;
  detail::Located<trieste::detail::Pattern>::Located(&local_7428,&local_b4d8);
  local_73a8 = (vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
                *)0x0;
  pvStack_73a0 = (vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
                  *)0x0;
  local_7390 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2889:12)>
               ::_M_invoke;
  local_7398 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2889:12)>
               ::_M_manager;
  local_b258._M_dataplus._M_p = Literal;
  In<trieste::TokenDef>((Pattern *)local_9918,(Token *)&local_b258,(TokenDef *)Folded);
  local_b4e8.name = BlockGroup;
  T(&local_9990,(Token *)&local_b4e8);
  local_b6b8.def = (TokenDef *)IndentIndicator;
  T(&local_9af8,&local_b6b8);
  local_b6c0.def = (TokenDef *)IndentIndicator;
  detail::Pattern::operator[](&local_a368,&local_9af8,&local_b6c0);
  local_b6c8.def = (TokenDef *)BlockLine;
  T(&local_9c60,&local_b6c8);
  detail::Pattern::operator++(&local_9be8,&local_9c60,0);
  local_b6d0.def = (TokenDef *)BlockLine;
  detail::Pattern::operator[](&local_9b70,&local_9be8,&local_b6d0);
  detail::Pattern::operator*(&local_9a80,&local_a368,&local_9b70);
  detail::Pattern::Pattern(&local_9cd8,(Pattern *)End);
  detail::Pattern::operator*(&local_9a08,&local_9a80,&local_9cd8);
  detail::Pattern::operator<<(&local_a2f0,&local_9990,&local_9a08);
  detail::Pattern::operator*(&local_adb8,(Pattern *)local_9918,&local_a2f0);
  detail::Pattern::Pattern((Pattern *)&__a2_4,&local_adb8);
  local_b360 = &PTR_s__workspace_llm4binary_github_lic_00254810;
  detail::Located<trieste::detail::Pattern>::Located
            (&local_7388,(Located<trieste::detail::Pattern> *)&__a2_4);
  local_7308 = (vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
                *)0x0;
  pvStack_7300 = (vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
                  *)0x0;
  local_72f0 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2901:12)>
               ::_M_invoke;
  local_72f8 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2901:12)>
               ::_M_manager;
  local_b6d8.def = (TokenDef *)Literal;
  In<trieste::TokenDef>(&local_9dc8,&local_b6d8,(TokenDef *)Folded);
  local_b6e0.def = (TokenDef *)BlockGroup;
  T(&local_9eb8,&local_b6e0);
  local_b6e8.def = (TokenDef *)ChompIndicator;
  T(&local_a098,&local_b6e8);
  local_b6f0.def = (TokenDef *)ChompIndicator;
  detail::Pattern::operator[](&local_a020,&local_a098,&local_b6f0);
  local_b6f8.def = (TokenDef *)BlockLine;
  T(&local_9798,&local_b6f8);
  detail::Pattern::operator++(&local_a188,&local_9798,0);
  local_b700.def = (TokenDef *)BlockLine;
  detail::Pattern::operator[](&local_a110,&local_a188,&local_b700);
  detail::Pattern::operator*(&local_9fa8,&local_a020,&local_a110);
  detail::Pattern::Pattern(&local_9810,(Pattern *)End);
  detail::Pattern::operator*(&local_9f30,&local_9fa8,&local_9810);
  detail::Pattern::operator<<(&local_9e40,&local_9eb8,&local_9f30);
  detail::Pattern::operator*(&local_9d50,&local_9dc8,&local_9e40);
  detail::Pattern::Pattern((Pattern *)&__a2_2,&local_9d50);
  local_b3e0 = &PTR_s__workspace_llm4binary_github_lic_00254828;
  detail::Located<trieste::detail::Pattern>::Located
            (&local_72e8,(Located<trieste::detail::Pattern> *)&__a2_2);
  local_94a8.pattern.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)&__a2;
  local_7268 = (vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
                *)0x0;
  pvStack_7260 = (vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
                  *)0x0;
  local_7250 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2913:12)>
               ::_M_invoke;
  local_7258 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2913:12)>
               ::_M_manager;
  local_94a8.pattern.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x6;
  PassDef::PassDef((PassDef *)local_6cf8,(string *)&local_9888,
                   (Wellformed *)(anonymous_namespace)::wf_quotes,5,
                   (initializer_list<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>
                    *)&local_94a8);
  lVar3 = 800;
  do {
    std::
    pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>
    ::~pair((pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>
             *)(&__a2 + lVar3));
    lVar3 = lVar3 + -0xa0;
  } while (lVar3 != -0xa0);
  detail::Pattern::~Pattern((Pattern *)&__a2_2);
  detail::Pattern::~Pattern(&local_9d50);
  detail::Pattern::~Pattern(&local_9e40);
  detail::Pattern::~Pattern(&local_9f30);
  detail::Pattern::~Pattern(&local_9810);
  detail::Pattern::~Pattern(&local_9fa8);
  detail::Pattern::~Pattern(&local_a110);
  detail::Pattern::~Pattern(&local_a188);
  detail::Pattern::~Pattern(&local_9798);
  detail::Pattern::~Pattern(&local_a020);
  detail::Pattern::~Pattern(&local_a098);
  detail::Pattern::~Pattern(&local_9eb8);
  detail::Pattern::~Pattern(&local_9dc8);
  detail::Pattern::~Pattern((Pattern *)&__a2_4);
  detail::Pattern::~Pattern(&local_adb8);
  detail::Pattern::~Pattern(&local_a2f0);
  detail::Pattern::~Pattern(&local_9a08);
  detail::Pattern::~Pattern(&local_9cd8);
  detail::Pattern::~Pattern(&local_9a80);
  detail::Pattern::~Pattern(&local_9b70);
  detail::Pattern::~Pattern(&local_9be8);
  detail::Pattern::~Pattern(&local_9c60);
  detail::Pattern::~Pattern(&local_a368);
  detail::Pattern::~Pattern(&local_9af8);
  detail::Pattern::~Pattern(&local_9990);
  detail::Pattern::~Pattern((Pattern *)local_9918);
  detail::Pattern::~Pattern(&local_b4d8.value);
  detail::Pattern::~Pattern(&local_ae30);
  detail::Pattern::~Pattern(&local_abd8);
  detail::Pattern::~Pattern(&local_acc8);
  detail::Pattern::~Pattern(&local_a7a0);
  detail::Pattern::~Pattern(&local_a3e0);
  detail::Pattern::~Pattern(&local_a6b0);
  detail::Pattern::~Pattern(&local_ad40);
  detail::Pattern::~Pattern(&local_a728);
  detail::Pattern::~Pattern(&local_a458);
  detail::Pattern::~Pattern(&local_a5c0);
  detail::Pattern::~Pattern(&local_a638);
  detail::Pattern::~Pattern(&local_a4d0);
  detail::Pattern::~Pattern(&local_a548);
  detail::Pattern::~Pattern(&local_ac50);
  detail::Pattern::~Pattern(&local_ab60);
  detail::Pattern::~Pattern(&local_b688.value);
  detail::Pattern::~Pattern(&local_b020);
  detail::Pattern::~Pattern(&local_a818);
  detail::Pattern::~Pattern(&local_a908);
  detail::Pattern::~Pattern(&local_aae8);
  detail::Pattern::~Pattern(&local_a980);
  detail::Pattern::~Pattern(&local_a9f8);
  detail::Pattern::~Pattern(&local_aa70);
  detail::Pattern::~Pattern(&local_a890);
  detail::Pattern::~Pattern(&local_b190);
  detail::Pattern::~Pattern(&local_b568.value);
  detail::Pattern::~Pattern(&local_b358.value);
  detail::Pattern::~Pattern(&local_b118);
  detail::Pattern::~Pattern(&local_af30.value);
  detail::Pattern::~Pattern((Pattern *)&__a2_3);
  detail::Pattern::~Pattern((Pattern *)local_8f08);
  detail::Pattern::~Pattern(&local_b210.value);
  detail::Pattern::~Pattern(&local_b2d8.value);
  detail::Pattern::~Pattern((Pattern *)&__a2_6);
  detail::Pattern::~Pattern((Pattern *)&__a2_7);
  std::__cxx11::string::~string((string *)&local_9888);
  ___a2 = (element_type *)0x0;
  std::function<unsigned_long_(std::shared_ptr<trieste::NodeDef>)>::operator=
            (local_6468,(function<unsigned_long_(std::shared_ptr<trieste::NodeDef>)> *)&__a2);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&__a2);
  std::make_shared<trieste::PassDef,trieste::PassDef_const>((PassDef *)(local_a1b8 + 0x10));
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_9160,"anchors",&local_b719);
  local_b4e8.name = SingleQuote;
  In<trieste::TokenDef>(&local_b118,(Token *)&local_b4e8,(TokenDef *)DoubleQuote);
  local_b6b8.def = (TokenDef *)BlockLine;
  T(&local_a890,&local_b6b8);
  local_b6c0.def = (TokenDef *)Lhs;
  detail::Pattern::operator[](&local_a818,&local_a890,&local_b6c0);
  local_b6c8.def = (TokenDef *)BlockLine;
  T(&local_a980,&local_b6c8);
  local_b6d0.def = (TokenDef *)Rhs;
  detail::Pattern::operator[](&local_a908,&local_a980,&local_b6d0);
  detail::Pattern::operator*(&local_b190,&local_a818,&local_a908);
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x40);
  p_Var2->_M_use_count = 1;
  p_Var2->_M_weak_count = 1;
  p_Var2->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_002549d8;
  local_b688.value.pattern.
  super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&__a2_4;
  CLI::std::__shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2> *)&local_b568,
             (__shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2> *)&local_b190);
  p_Var2[1]._M_use_count = 0;
  p_Var2[1]._M_weak_count = 0;
  p_Var2[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var2[1]._vptr__Sp_counted_base = (_func_int **)&PTR__Action_00254a28;
  CLI::std::__shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2> *)(p_Var2 + 3),
             (__shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2> *)&local_b568);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_b568.value.pattern.
              super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  local_b688.value.pattern.
  super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<trieste::detail::Action<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2935:53)>,_std::allocator<trieste::detail::Action<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2935:53)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<trieste::detail::Action<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_microsoft[P]verona_build_O2__deps_trieste_src_parsers_yaml_reader_cc:2935:53)>,_std::allocator<trieste::detail::Action<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_microsoft[P]verona_build_O2__deps_trieste_src_parsers_yaml_reader_cc:2935:53)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                      *)&local_b688);
  local_b4d8.value.pattern.
  super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_b4d8.value.pattern.
  super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_b688.value.pattern.
  super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var2 + 1);
  local_b688.value.pattern.
  super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var2;
  detail::FastPattern::FastPattern((FastPattern *)&local_b568,&local_b190.fast_pattern);
  detail::Pattern::Pattern(&local_b020,(PatternPtr *)&local_b688,(FastPattern *)&local_b568);
  detail::FastPattern::~FastPattern((FastPattern *)&local_b568);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_b688.value.pattern.
              super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_b4d8.value.pattern.
              super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  detail::Pattern::operator*((Pattern *)&__a2_3,&local_b118,&local_b020);
  detail::Pattern::Pattern(&local_b568.value,(Pattern *)&__a2_3);
  local_b568.location.location._M_impl =
       (source_location)&PTR_s__workspace_llm4binary_github_lic_002548b0;
  detail::Located<trieste::detail::Pattern>::Located
            ((Located<trieste::detail::Pattern> *)local_8f08,&local_b568);
  local_8f08._128_8_ = 0;
  p_Stack_8e80 = (_Manager_type)0x0;
  local_8e70 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2939:11)>
               ::_M_invoke;
  local_8e78 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2939:11)>
               ::_M_manager;
  local_b6d8.def = (TokenDef *)SingleQuote;
  In<trieste::TokenDef>(&local_aa70,&local_b6d8,(TokenDef *)DoubleQuote);
  local_b6e0.def = (TokenDef *)EmptyLine;
  T(&local_abd8,&local_b6e0);
  local_b6e8.def = (TokenDef *)Lhs;
  detail::Pattern::operator[](&local_ab60,&local_abd8,&local_b6e8);
  local_b6f0.def = (TokenDef *)BlockLine;
  T(&local_acc8,&local_b6f0);
  local_b6f8.def = (TokenDef *)Rhs;
  detail::Pattern::operator[](&local_ac50,&local_acc8,&local_b6f8);
  detail::Pattern::operator*(&local_ae30,&local_ab60,&local_ac50);
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x40);
  p_Var2->_M_use_count = 1;
  p_Var2->_M_weak_count = 1;
  p_Var2->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00254a98;
  local_b4d8.value.pattern.
  super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&__a2_2;
  CLI::std::__shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2> *)&local_b688,
             (__shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2> *)&local_ae30);
  p_Var2[1]._M_use_count = 0;
  p_Var2[1]._M_weak_count = 0;
  p_Var2[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var2[1]._vptr__Sp_counted_base = (_func_int **)&PTR__Action_00254ae8;
  CLI::std::__shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2> *)(p_Var2 + 3),
             (__shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2> *)&local_b688);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_b688.value.pattern.
              super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  local_b4d8.value.pattern.
  super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<trieste::detail::Action<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2943:15)>,_std::allocator<trieste::detail::Action<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2943:15)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<trieste::detail::Action<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_microsoft[P]verona_build_O2__deps_trieste_src_parsers_yaml_reader_cc:2943:15)>,_std::allocator<trieste::detail::Action<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_microsoft[P]verona_build_O2__deps_trieste_src_parsers_yaml_reader_cc:2943:15)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                      *)&local_b4d8);
  ___a2_4 = (element_type *)0x0;
  a_Stack_b3d0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_b4d8.value.pattern.
  super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var2 + 1);
  local_b4d8.value.pattern.
  super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var2;
  detail::FastPattern::FastPattern((FastPattern *)&local_b688,&local_ae30.fast_pattern);
  detail::Pattern::Pattern(&local_aae8,(PatternPtr *)&local_b4d8,(FastPattern *)&local_b688);
  detail::FastPattern::~FastPattern((FastPattern *)&local_b688);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_b4d8.value.pattern.
              super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_b3d0);
  detail::Pattern::operator*(&local_a9f8,&local_aa70,&local_aae8);
  detail::Pattern::Pattern(&local_b688.value,&local_a9f8);
  local_b688.location.location._M_impl =
       (source_location)&PTR_s__workspace_llm4binary_github_lic_002548c8;
  detail::Located<trieste::detail::Pattern>::Located(&local_8e68,&local_b688);
  local_8de8 = 0;
  auStack_8de0._0_8_ = 0;
  local_8dd0 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2944:11)>
               ::_M_invoke;
  auStack_8de0._8_8_ =
       std::
       _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2944:11)>
       ::_M_manager;
  local_b700.def = (TokenDef *)&AnchorValue;
  In<>(&local_a458,&local_b700);
  local_b708.def = (TokenDef *)&AnchorValue;
  T(&local_a548,&local_b708);
  local_b690.def = (TokenDef *)&AnchorValue;
  detail::Pattern::operator[](&local_a4d0,&local_a548,&local_b690);
  detail::Pattern::operator*(&local_a3e0,&local_a458,&local_a4d0);
  detail::Pattern::Pattern(&local_b4d8.value,&local_a3e0);
  local_b4d8.location.location._M_impl =
       (source_location)&PTR_s__workspace_llm4binary_github_lic_002548e0;
  detail::Located<trieste::detail::Pattern>::Located(&local_8dc8,&local_b4d8);
  local_8d48 = 0;
  uStack_8d40 = 0;
  local_8d30 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2947:11)>
               ::_M_invoke;
  local_8d38 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2947:11)>
               ::_M_manager;
  local_b698.def = (TokenDef *)&AnchorValue;
  In<>(&local_a638,&local_b698);
  local_b6a0.def = (TokenDef *)Anchor;
  T(&local_a728,&local_b6a0);
  local_b6a8.def = (TokenDef *)Anchor;
  detail::Pattern::operator[](&local_ad40,&local_a728,&local_b6a8);
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x40);
  ___a2_2 = (element_type *)&__a2_6;
  p_Var2->_M_use_count = 1;
  p_Var2->_M_weak_count = 1;
  p_Var2->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00254b68;
  CLI::std::__shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2> *)&__a2_4,
             (__shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2> *)&local_ad40);
  p_Var2[1]._M_use_count = 0;
  p_Var2[1]._M_weak_count = 0;
  p_Var2[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var2[1]._vptr__Sp_counted_base = (_func_int **)&PTR__Action_00254bb8;
  CLI::std::__shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2> *)(p_Var2 + 3),
             (__shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2> *)&__a2_4);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_b3d0);
  local_b450[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<trieste::detail::Action<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2951:45)>,_std::allocator<trieste::detail::Action<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2951:45)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<trieste::detail::Action<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_microsoft[P]verona_build_O2__deps_trieste_src_parsers_yaml_reader_cc:2951:45)>,_std::allocator<trieste::detail::Action<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_microsoft[P]verona_build_O2__deps_trieste_src_parsers_yaml_reader_cc:2951:45)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                      *)&__a2_2);
  local_b210.value.pattern.
  super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_b210.value.pattern.
  super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ___a2_2 = (element_type *)(p_Var2 + 1);
  local_b450[0]._M_pi = p_Var2;
  detail::FastPattern::FastPattern((FastPattern *)&__a2_4,&local_ad40.fast_pattern);
  detail::Pattern::Pattern(&local_a6b0,(PatternPtr *)&__a2_2,(FastPattern *)&__a2_4);
  detail::FastPattern::~FastPattern((FastPattern *)&__a2_4);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_b450);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_b210.value.pattern.
              super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  detail::Pattern::operator*(&local_a5c0,&local_a638,&local_a6b0);
  detail::Pattern::Pattern((Pattern *)&__a2_4,&local_a5c0);
  local_b360 = &PTR_s__workspace_llm4binary_github_lic_002548f8;
  detail::Located<trieste::detail::Pattern>::Located
            (&local_8d28,(Located<trieste::detail::Pattern> *)&__a2_4);
  local_8ca8 = 0;
  uStack_8ca0 = 0;
  local_8c90 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2962:11)>
               ::_M_invoke;
  local_8c98 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2962:11)>
               ::_M_manager;
  local_b6b0.def = (TokenDef *)Alias;
  T((Pattern *)local_9918,&local_b6b0);
  local_b570.def = (TokenDef *)Alias;
  detail::Pattern::operator[](&local_adb8,(Pattern *)local_9918,&local_b570);
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x40);
  local_b210.value.pattern.
  super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&__a2_7;
  p_Var2->_M_use_count = 1;
  p_Var2->_M_weak_count = 1;
  p_Var2->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00254c28;
  CLI::std::__shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2> *)&__a2_2,
             (__shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2> *)&local_adb8);
  p_Var2[1]._M_use_count = 0;
  p_Var2[1]._M_weak_count = 0;
  p_Var2[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var2[1]._vptr__Sp_counted_base = (_func_int **)&PTR__Action_00254c78;
  CLI::std::__shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2> *)(p_Var2 + 3),
             (__shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2> *)&__a2_2);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_b450);
  local_b210.value.pattern.
  super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<trieste::detail::Action<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2972:25)>,_std::allocator<trieste::detail::Action<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2972:25)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<trieste::detail::Action<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_microsoft[P]verona_build_O2__deps_trieste_src_parsers_yaml_reader_cc:2972:25)>,_std::allocator<trieste::detail::Action<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_microsoft[P]verona_build_O2__deps_trieste_src_parsers_yaml_reader_cc:2972:25)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                      *)&local_b210);
  ___a2_6 = (element_type *)0x0;
  a_Stack_b098[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_b210.value.pattern.
  super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var2 + 1);
  local_b210.value.pattern.
  super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var2;
  detail::FastPattern::FastPattern((FastPattern *)&__a2_2,&local_adb8.fast_pattern);
  detail::Pattern::Pattern(&local_a7a0,(PatternPtr *)&local_b210,(FastPattern *)&__a2_2);
  detail::FastPattern::~FastPattern((FastPattern *)&__a2_2);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_b210.value.pattern.
              super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_b098);
  detail::Pattern::Pattern((Pattern *)&__a2_2,&local_a7a0);
  local_b3e0 = &PTR_s__workspace_llm4binary_github_lic_00254910;
  detail::Located<trieste::detail::Pattern>::Located
            (&local_8c88,(Located<trieste::detail::Pattern> *)&__a2_2);
  local_8c08 = 0;
  uStack_8c00 = 0;
  local_8bf0 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2976:11)>
               ::_M_invoke;
  local_8bf8 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2976:11)>
               ::_M_manager;
  local_b578.def = (TokenDef *)&AnchorValue;
  In<>(&local_9990,&local_b578);
  local_b580.def = (TokenDef *)Alias;
  T(&local_9a80,&local_b580);
  local_b588.def = (TokenDef *)Alias;
  detail::Pattern::operator[](&local_9a08,&local_9a80,&local_b588);
  detail::Pattern::operator*(&local_a2f0,&local_9990,&local_9a08);
  detail::Pattern::Pattern(&local_b210.value,&local_a2f0);
  local_b210.location.location._M_impl =
       (source_location)&PTR_s__workspace_llm4binary_github_lic_00254928;
  detail::Located<trieste::detail::Pattern>::Located(&local_8be8,&local_b210);
  local_8b68 = 0;
  uStack_8b60 = 0;
  local_8b50 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2991:11)>
               ::_M_invoke;
  local_8b58 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2991:11)>
               ::_M_manager;
  local_b590.def = (TokenDef *)FlowMapping;
  In<trieste::TokenDef>(&local_9af8,&local_b590,(TokenDef *)Mapping);
  local_b598.def = (TokenDef *)&MappingItem;
  T(&local_9be8,&local_b598);
  local_b5a0.def = (TokenDef *)DoubleQuote;
  T(&local_9d50,&local_b5a0);
  local_b5a8.def = (TokenDef *)Key;
  detail::Pattern::operator[](&local_9cd8,&local_9d50,&local_b5a8);
  local_b5b0.def = (TokenDef *)BlockLine;
  T(&local_9e40,&local_b5b0);
  local_b5b8.def = (TokenDef *)BlockLine;
  T(&local_9eb8,&local_b5b8);
  detail::Pattern::operator*(&local_9dc8,&local_9e40,&local_9eb8);
  detail::Pattern::operator<<(&local_9c60,&local_9cd8,&local_9dc8);
  detail::Pattern::operator<<(&local_9b70,&local_9be8,&local_9c60);
  detail::Pattern::operator*(&local_a368,&local_9af8,&local_9b70);
  detail::Pattern::Pattern((Pattern *)&__a2_6,&local_a368);
  local_b028 = &PTR_s__workspace_llm4binary_github_lic_00254940;
  detail::Located<trieste::detail::Pattern>::Located
            (&local_8b48,(Located<trieste::detail::Pattern> *)&__a2_6);
  local_8ac8 = 0;
  uStack_8ac0 = 0;
  local_8ab0 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2996:11)>
               ::_M_invoke;
  local_8ab8 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:2996:11)>
               ::_M_manager;
  local_b5c0.def = (TokenDef *)FlowMapping;
  In<trieste::TokenDef>(&local_9fa8,&local_b5c0,(TokenDef *)Mapping);
  local_b5c8.def = (TokenDef *)&MappingItem;
  T(&local_a098,&local_b5c8);
  local_b5d0.def = (TokenDef *)SingleQuote;
  T(&local_9798,&local_b5d0);
  local_b5d8.def = (TokenDef *)Key;
  detail::Pattern::operator[](&local_a188,&local_9798,&local_b5d8);
  local_b5e0.def = (TokenDef *)BlockLine;
  T(&local_9888,&local_b5e0);
  local_b5e8.def = (TokenDef *)BlockLine;
  T(&local_94a8,&local_b5e8);
  detail::Pattern::operator*(&local_9810,&local_9888,&local_94a8);
  detail::Pattern::operator<<(&local_a110,&local_a188,&local_9810);
  detail::Pattern::operator<<(&local_a020,&local_a098,&local_a110);
  detail::Pattern::operator*(&local_9f30,&local_9fa8,&local_a020);
  detail::Pattern::Pattern((Pattern *)&__a2_7,&local_9f30);
  detail::Located<trieste::detail::Pattern>::Located
            (&local_8aa8,(Located<trieste::detail::Pattern> *)&__a2_7);
  local_8a28 = 0;
  uStack_8a20 = 0;
  local_8a10 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:3001:11)>
               ::_M_invoke;
  local_8a18 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:3001:11)>
               ::_M_manager;
  local_b5f0.def = (TokenDef *)Mapping;
  In<>(&local_9520,&local_b5f0);
  local_b5f8.def = (TokenDef *)&MappingItem;
  T(&local_92c8,&local_b5f8);
  local_b600.def = (TokenDef *)&MappingItem;
  T(&local_93b8,&local_b600);
  local_b608.def = (TokenDef *)&MappingItem;
  detail::Pattern::operator[](&local_9340,&local_93b8,&local_b608);
  detail::Pattern::operator*(&local_9720,&local_92c8,&local_9340);
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x40);
  local_b358.value.pattern.
  super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&__a2_8;
  p_Var2->_M_use_count = 1;
  p_Var2->_M_weak_count = 1;
  p_Var2->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00254d18;
  CLI::std::__shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2> *)&local_b2d8,
             (__shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2> *)&local_9720);
  p_Var2[1]._M_use_count = 0;
  p_Var2[1]._M_weak_count = 0;
  p_Var2[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var2[1]._vptr__Sp_counted_base = (_func_int **)&PTR__Action_00254d68;
  CLI::std::__shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2> *)(p_Var2 + 3),
             (__shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2> *)&local_b2d8);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_b2d8.value.pattern.
              super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  local_b358.value.pattern.
  super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<trieste::detail::Action<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:3005:15)>,_std::allocator<trieste::detail::Action<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:3005:15)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<trieste::detail::Action<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_microsoft[P]verona_build_O2__deps_trieste_src_parsers_yaml_reader_cc:3005:15)>,_std::allocator<trieste::detail::Action<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_microsoft[P]verona_build_O2__deps_trieste_src_parsers_yaml_reader_cc:3005:15)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                      *)&local_b358);
  local_af30.value.pattern.
  super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_af30.value.pattern.
  super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_b358.value.pattern.
  super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var2 + 1);
  local_b358.value.pattern.
  super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var2;
  detail::FastPattern::FastPattern((FastPattern *)&local_b2d8,&local_9720.fast_pattern);
  detail::Pattern::Pattern(&local_9598,(PatternPtr *)&local_b358,(FastPattern *)&local_b2d8);
  detail::FastPattern::~FastPattern((FastPattern *)&local_b2d8);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_b358.value.pattern.
              super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_af30.value.pattern.
              super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  detail::Pattern::operator*((Pattern *)&__a2_8,&local_9520,&local_9598);
  detail::Pattern::Pattern(&local_b2d8.value,(Pattern *)&__a2_8);
  local_b2d8.location.location._M_impl =
       (source_location)&PTR_s__workspace_llm4binary_github_lic_00254970;
  detail::Located<trieste::detail::Pattern>::Located(&local_8a08,&local_b2d8);
  local_8988 = 0;
  uStack_8980 = 0;
  local_8970 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:3006:11)>
               ::_M_invoke;
  local_8978 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:3006:11)>
               ::_M_manager;
  local_b218.def = (TokenDef *)Mapping;
  In<trieste::TokenDef>(&local_9610,&local_b218,(TokenDef *)FlowMapping);
  local_b220.def = (TokenDef *)&Value;
  detail::Pattern::operator[](&local_8f80,(Pattern *)(anonymous_namespace)::ValueToken,&local_b220);
  detail::Pattern::operator*(&local_9430,&local_9610,&local_8f80);
  detail::Pattern::Pattern(&local_b358.value,&local_9430);
  local_b358.location.location._M_impl =
       (source_location)&PTR_s__workspace_llm4binary_github_lic_00254988;
  detail::Located<trieste::detail::Pattern>::Located(&local_8968,&local_b358);
  local_88e8 = 0;
  uStack_88e0 = 0;
  local_88d0 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:3013:11)>
               ::_M_invoke;
  local_88d8 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:3013:11)>
               ::_M_manager;
  local_b228.def = (TokenDef *)FlowSequence;
  In<>(&local_9250,&local_b228);
  local_b230.def = (TokenDef *)FlowEmpty;
  T(&local_90e8,&local_b230);
  local_b238.def = (TokenDef *)FlowEmpty;
  detail::Pattern::operator[](&local_9070,&local_90e8,&local_b238);
  detail::Pattern::operator*(&local_8ff8,(Pattern *)Start,&local_9070);
  detail::Pattern::operator*((Pattern *)&__a2_1,&local_9250,&local_8ff8);
  detail::Pattern::Pattern(&local_af30.value,(Pattern *)&__a2_1);
  local_af30.location.location._M_impl =
       (source_location)&PTR_s__workspace_llm4binary_github_lic_002549a0;
  detail::Located<trieste::detail::Pattern>::Located(&local_88c8,&local_af30);
  local_b258._M_dataplus._M_p = local_8f08;
  local_8848 = 0;
  uStack_8840 = 0;
  local_8830 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:3016:11)>
               ::_M_invoke;
  local_8838 = std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/trieste-src/parsers/yaml/reader.cc:3016:11)>
               ::_M_manager;
  local_b258._M_string_length = 0xb;
  PassDef::PassDef((PassDef *)&__a2,(string *)&local_9160,
                   (Wellformed *)(anonymous_namespace)::wf_anchors,1,
                   (initializer_list<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>
                    *)&local_b258);
  lVar3 = 0x640;
  do {
    std::
    pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>
    ::~pair((pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>
             *)(local_8f08 + lVar3));
    lVar3 = lVar3 + -0xa0;
  } while (lVar3 != -0xa0);
  detail::Pattern::~Pattern(&local_af30.value);
  detail::Pattern::~Pattern((Pattern *)&__a2_1);
  detail::Pattern::~Pattern(&local_8ff8);
  detail::Pattern::~Pattern(&local_9070);
  detail::Pattern::~Pattern(&local_90e8);
  detail::Pattern::~Pattern(&local_9250);
  detail::Pattern::~Pattern(&local_b358.value);
  detail::Pattern::~Pattern(&local_9430);
  detail::Pattern::~Pattern(&local_8f80);
  detail::Pattern::~Pattern(&local_9610);
  detail::Pattern::~Pattern(&local_b2d8.value);
  detail::Pattern::~Pattern((Pattern *)&__a2_8);
  detail::Pattern::~Pattern(&local_9598);
  detail::Pattern::~Pattern(&local_9720);
  detail::Pattern::~Pattern(&local_9340);
  detail::Pattern::~Pattern(&local_93b8);
  detail::Pattern::~Pattern(&local_92c8);
  detail::Pattern::~Pattern(&local_9520);
  detail::Pattern::~Pattern((Pattern *)&__a2_7);
  detail::Pattern::~Pattern(&local_9f30);
  detail::Pattern::~Pattern(&local_a020);
  detail::Pattern::~Pattern(&local_a110);
  detail::Pattern::~Pattern(&local_9810);
  detail::Pattern::~Pattern(&local_94a8);
  detail::Pattern::~Pattern(&local_9888);
  detail::Pattern::~Pattern(&local_a188);
  detail::Pattern::~Pattern(&local_9798);
  detail::Pattern::~Pattern(&local_a098);
  detail::Pattern::~Pattern(&local_9fa8);
  detail::Pattern::~Pattern((Pattern *)&__a2_6);
  detail::Pattern::~Pattern(&local_a368);
  detail::Pattern::~Pattern(&local_9b70);
  detail::Pattern::~Pattern(&local_9c60);
  detail::Pattern::~Pattern(&local_9dc8);
  detail::Pattern::~Pattern(&local_9eb8);
  detail::Pattern::~Pattern(&local_9e40);
  detail::Pattern::~Pattern(&local_9cd8);
  detail::Pattern::~Pattern(&local_9d50);
  detail::Pattern::~Pattern(&local_9be8);
  detail::Pattern::~Pattern(&local_9af8);
  detail::Pattern::~Pattern(&local_b210.value);
  detail::Pattern::~Pattern(&local_a2f0);
  detail::Pattern::~Pattern(&local_9a08);
  detail::Pattern::~Pattern(&local_9a80);
  detail::Pattern::~Pattern(&local_9990);
  detail::Pattern::~Pattern((Pattern *)&__a2_2);
  detail::Pattern::~Pattern(&local_a7a0);
  detail::Pattern::~Pattern(&local_adb8);
  detail::Pattern::~Pattern((Pattern *)local_9918);
  detail::Pattern::~Pattern((Pattern *)&__a2_4);
  detail::Pattern::~Pattern(&local_a5c0);
  detail::Pattern::~Pattern(&local_a6b0);
  detail::Pattern::~Pattern(&local_ad40);
  detail::Pattern::~Pattern(&local_a728);
  detail::Pattern::~Pattern(&local_a638);
  detail::Pattern::~Pattern(&local_b4d8.value);
  detail::Pattern::~Pattern(&local_a3e0);
  detail::Pattern::~Pattern(&local_a4d0);
  detail::Pattern::~Pattern(&local_a548);
  detail::Pattern::~Pattern(&local_a458);
  detail::Pattern::~Pattern(&local_b688.value);
  detail::Pattern::~Pattern(&local_a9f8);
  detail::Pattern::~Pattern(&local_aae8);
  detail::Pattern::~Pattern(&local_ae30);
  detail::Pattern::~Pattern(&local_ac50);
  detail::Pattern::~Pattern(&local_acc8);
  detail::Pattern::~Pattern(&local_ab60);
  detail::Pattern::~Pattern(&local_abd8);
  detail::Pattern::~Pattern(&local_aa70);
  detail::Pattern::~Pattern(&local_b568.value);
  detail::Pattern::~Pattern((Pattern *)&__a2_3);
  detail::Pattern::~Pattern(&local_b020);
  detail::Pattern::~Pattern(&local_b190);
  detail::Pattern::~Pattern(&local_a908);
  detail::Pattern::~Pattern(&local_a980);
  detail::Pattern::~Pattern(&local_a818);
  detail::Pattern::~Pattern(&local_a890);
  detail::Pattern::~Pattern(&local_b118);
  std::__cxx11::string::~string((string *)&local_9160);
  std::make_shared<trieste::PassDef,trieste::PassDef_const>((PassDef *)local_a198);
  this = local_b718;
  __l._M_len = 0xf;
  __l._M_array = (iterator)local_a278;
  std::
  vector<std::shared_ptr<trieste::PassDef>,_std::allocator<std::shared_ptr<trieste::PassDef>_>_>::
  vector(&local_98a0,__l,(allocator_type *)&local_b568);
  parser();
  Reader::Reader(this,&local_9630,&local_98a0,(Parse *)local_8f08);
  Parse::~Parse((Parse *)local_8f08);
  CLI::std::
  vector<std::shared_ptr<trieste::PassDef>,_std::allocator<std::shared_ptr<trieste::PassDef>_>_>::
  ~vector((vector<std::shared_ptr<trieste::PassDef>,_std::allocator<std::shared_ptr<trieste::PassDef>_>_>
           *)&local_98a0);
  lVar3 = 0xe8;
  do {
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a278 + lVar3));
    lVar3 = lVar3 + -0x10;
  } while (lVar3 != -8);
  PassDef::~PassDef((PassDef *)&__a2);
  PassDef::~PassDef((PassDef *)local_6cf8);
  PassDef::~PassDef(&local_51c0);
  PassDef::~PassDef((PassDef *)local_8828);
  PassDef::~PassDef((PassDef *)local_63e0);
  PassDef::~PassDef(&local_48b0);
  PassDef::~PassDef((PassDef *)&local_7f18);
  PassDef::~PassDef(&local_3690);
  PassDef::~PassDef((PassDef *)local_3fa0);
  PassDef::~PassDef(&local_2d80);
  PassDef::~PassDef(&local_2470);
  PassDef::~PassDef(&local_1b60);
  PassDef::~PassDef(&local_1250);
  PassDef::~PassDef((PassDef *)local_5ad0);
  PassDef::~PassDef(&local_940);
  std::__cxx11::string::~string((string *)&local_9630);
  return (int)this;
}

Assistant:

Reader reader()
    {
      return {
        "yaml",
        {
          groups(),
          values(),
          flow(),
          lines(),
          indents(),
          colgroups(),
          items(),
          complex(),
          blocks(),
          collections(),
          attributes(),
          structure(),
          tags(),
          quotes(),
          anchors(),
        },
        parser()};
    }